

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  Primitive PVar9;
  uint uVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  code *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [28];
  undefined1 auVar82 [28];
  uint uVar83;
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  long lVar87;
  Primitive *pPVar88;
  long lVar89;
  undefined4 uVar90;
  undefined8 unaff_R14;
  ulong uVar91;
  undefined8 uVar92;
  float fVar112;
  vint4 bi_2;
  undefined1 auVar93 [16];
  float fVar110;
  float fVar114;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar111;
  float fVar113;
  float fVar115;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar97 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined8 uVar119;
  vint4 bi_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  vint4 ai_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  vint4 ai;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  vint4 bi;
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  vint4 ai_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  float fVar198;
  float fVar205;
  float fVar206;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar208;
  float fVar210;
  float fVar212;
  float fVar214;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar204 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined4 uVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar228 [32];
  undefined1 auVar227 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 (*local_688) [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [2] [32];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar85 = (ulong)(byte)PVar9;
  auVar165 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar165 = vinsertps_avx(auVar165,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar165 = vsubps_avx(auVar165,*(undefined1 (*) [16])(prim + uVar85 * 0x19 + 6));
  fVar141 = *(float *)(prim + uVar85 * 0x19 + 0x12);
  auVar93._0_4_ = fVar141 * auVar165._0_4_;
  auVar93._4_4_ = fVar141 * auVar165._4_4_;
  auVar93._8_4_ = fVar141 * auVar165._8_4_;
  auVar93._12_4_ = fVar141 * auVar165._12_4_;
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar180._0_4_ = fVar141 * auVar15._0_4_;
  auVar180._4_4_ = fVar141 * auVar15._4_4_;
  auVar180._8_4_ = fVar141 * auVar15._8_4_;
  auVar180._12_4_ = fVar141 * auVar15._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xc + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xd + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x12 + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x13 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x14 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar231._4_4_ = auVar180._0_4_;
  auVar231._0_4_ = auVar180._0_4_;
  auVar231._8_4_ = auVar180._0_4_;
  auVar231._12_4_ = auVar180._0_4_;
  auVar142 = vshufps_avx(auVar180,auVar180,0x55);
  auVar94 = vshufps_avx(auVar180,auVar180,0xaa);
  fVar141 = auVar94._0_4_;
  auVar215._0_4_ = fVar141 * auVar16._0_4_;
  fVar110 = auVar94._4_4_;
  auVar215._4_4_ = fVar110 * auVar16._4_4_;
  fVar112 = auVar94._8_4_;
  auVar215._8_4_ = fVar112 * auVar16._8_4_;
  fVar114 = auVar94._12_4_;
  auVar215._12_4_ = fVar114 * auVar16._12_4_;
  auVar199._0_4_ = auVar168._0_4_ * fVar141;
  auVar199._4_4_ = auVar168._4_4_ * fVar110;
  auVar199._8_4_ = auVar168._8_4_ * fVar112;
  auVar199._12_4_ = auVar168._12_4_ * fVar114;
  auVar194._0_4_ = auVar121._0_4_ * fVar141;
  auVar194._4_4_ = auVar121._4_4_ * fVar110;
  auVar194._8_4_ = auVar121._8_4_ * fVar112;
  auVar194._12_4_ = auVar121._12_4_ * fVar114;
  auVar94 = vfmadd231ps_fma(auVar215,auVar142,auVar15);
  auVar122 = vfmadd231ps_fma(auVar199,auVar142,auVar18);
  auVar142 = vfmadd231ps_fma(auVar194,auVar95,auVar142);
  auVar157 = vfmadd231ps_fma(auVar94,auVar231,auVar165);
  auVar122 = vfmadd231ps_fma(auVar122,auVar231,auVar17);
  auVar161 = vfmadd231ps_fma(auVar142,auVar96,auVar231);
  auVar232._4_4_ = auVar93._0_4_;
  auVar232._0_4_ = auVar93._0_4_;
  auVar232._8_4_ = auVar93._0_4_;
  auVar232._12_4_ = auVar93._0_4_;
  auVar142 = vshufps_avx(auVar93,auVar93,0x55);
  auVar94 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar141 = auVar94._0_4_;
  auVar181._0_4_ = fVar141 * auVar16._0_4_;
  fVar110 = auVar94._4_4_;
  auVar181._4_4_ = fVar110 * auVar16._4_4_;
  fVar112 = auVar94._8_4_;
  auVar181._8_4_ = fVar112 * auVar16._8_4_;
  fVar114 = auVar94._12_4_;
  auVar181._12_4_ = fVar114 * auVar16._12_4_;
  auVar120._0_4_ = auVar168._0_4_ * fVar141;
  auVar120._4_4_ = auVar168._4_4_ * fVar110;
  auVar120._8_4_ = auVar168._8_4_ * fVar112;
  auVar120._12_4_ = auVar168._12_4_ * fVar114;
  auVar94._0_4_ = auVar121._0_4_ * fVar141;
  auVar94._4_4_ = auVar121._4_4_ * fVar110;
  auVar94._8_4_ = auVar121._8_4_ * fVar112;
  auVar94._12_4_ = auVar121._12_4_ * fVar114;
  auVar15 = vfmadd231ps_fma(auVar181,auVar142,auVar15);
  auVar16 = vfmadd231ps_fma(auVar120,auVar142,auVar18);
  auVar18 = vfmadd231ps_fma(auVar94,auVar142,auVar95);
  auVar95 = vfmadd231ps_fma(auVar15,auVar232,auVar165);
  auVar121 = vfmadd231ps_fma(auVar16,auVar232,auVar17);
  local_270._8_4_ = 0x7fffffff;
  local_270._0_8_ = 0x7fffffff7fffffff;
  local_270._12_4_ = 0x7fffffff;
  auVar165 = vandps_avx(auVar157,local_270);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar165 = vcmpps_avx(auVar165,auVar189,1);
  auVar15 = vblendvps_avx(auVar157,auVar189,auVar165);
  auVar165 = vandps_avx(auVar122,local_270);
  auVar165 = vcmpps_avx(auVar165,auVar189,1);
  auVar16 = vblendvps_avx(auVar122,auVar189,auVar165);
  auVar165 = vandps_avx(auVar161,local_270);
  auVar165 = vcmpps_avx(auVar165,auVar189,1);
  auVar165 = vblendvps_avx(auVar161,auVar189,auVar165);
  auVar142 = vfmadd231ps_fma(auVar18,auVar232,auVar96);
  auVar17 = vrcpps_avx(auVar15);
  auVar190._8_4_ = 0x3f800000;
  auVar190._0_8_ = 0x3f8000003f800000;
  auVar190._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar190);
  auVar17 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar190);
  auVar168 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar165);
  auVar165 = vfnmadd213ps_fma(auVar165,auVar15,auVar190);
  auVar96 = vfmadd132ps_fma(auVar165,auVar15,auVar15);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar165 = vpmovsxwd_avx(auVar165);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar95);
  auVar161._0_4_ = auVar17._0_4_ * auVar165._0_4_;
  auVar161._4_4_ = auVar17._4_4_ * auVar165._4_4_;
  auVar161._8_4_ = auVar17._8_4_ * auVar165._8_4_;
  auVar161._12_4_ = auVar17._12_4_ * auVar165._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar165 = vpmovsxwd_avx(auVar15);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar95);
  auVar175._0_4_ = auVar17._0_4_ * auVar165._0_4_;
  auVar175._4_4_ = auVar17._4_4_ * auVar165._4_4_;
  auVar175._8_4_ = auVar17._8_4_ * auVar165._8_4_;
  auVar175._12_4_ = auVar17._12_4_ * auVar165._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar85 * 0xe + 6);
  auVar165 = vpmovsxwd_avx(auVar16);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar121);
  auVar182._0_4_ = auVar168._0_4_ * auVar165._0_4_;
  auVar182._4_4_ = auVar168._4_4_ * auVar165._4_4_;
  auVar182._8_4_ = auVar168._8_4_ * auVar165._8_4_;
  auVar182._12_4_ = auVar168._12_4_ * auVar165._12_4_;
  auVar122._1_3_ = 0;
  auVar122[0] = PVar9;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar165 = vpmovsxwd_avx(auVar17);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar15 = vsubps_avx(auVar165,auVar121);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar85 * 0x15 + 6);
  auVar165 = vpmovsxwd_avx(auVar18);
  auVar121._0_4_ = auVar168._0_4_ * auVar15._0_4_;
  auVar121._4_4_ = auVar168._4_4_ * auVar15._4_4_;
  auVar121._8_4_ = auVar168._8_4_ * auVar15._8_4_;
  auVar121._12_4_ = auVar168._12_4_ * auVar15._12_4_;
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar142);
  auVar157._0_4_ = auVar96._0_4_ * auVar165._0_4_;
  auVar157._4_4_ = auVar96._4_4_ * auVar165._4_4_;
  auVar157._8_4_ = auVar96._8_4_ * auVar165._8_4_;
  auVar157._12_4_ = auVar96._12_4_ * auVar165._12_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar85 * 0x17 + 6);
  auVar165 = vpmovsxwd_avx(auVar168);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar142);
  auVar95._0_4_ = auVar96._0_4_ * auVar165._0_4_;
  auVar95._4_4_ = auVar96._4_4_ * auVar165._4_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar165._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar165._12_4_;
  auVar165 = vpminsd_avx(auVar161,auVar175);
  auVar15 = vpminsd_avx(auVar182,auVar121);
  auVar165 = vmaxps_avx(auVar165,auVar15);
  auVar15 = vpminsd_avx(auVar157,auVar95);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar200._4_4_ = uVar90;
  auVar200._0_4_ = uVar90;
  auVar200._8_4_ = uVar90;
  auVar200._12_4_ = uVar90;
  auVar15 = vmaxps_avx(auVar15,auVar200);
  auVar165 = vmaxps_avx(auVar165,auVar15);
  local_280._0_4_ = auVar165._0_4_ * 0.99999964;
  local_280._4_4_ = auVar165._4_4_ * 0.99999964;
  local_280._8_4_ = auVar165._8_4_ * 0.99999964;
  local_280._12_4_ = auVar165._12_4_ * 0.99999964;
  auVar165 = vpmaxsd_avx(auVar161,auVar175);
  auVar15 = vpmaxsd_avx(auVar182,auVar121);
  auVar165 = vminps_avx(auVar165,auVar15);
  auVar15 = vpmaxsd_avx(auVar157,auVar95);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar142._4_4_ = uVar90;
  auVar142._0_4_ = uVar90;
  auVar142._8_4_ = uVar90;
  auVar142._12_4_ = uVar90;
  auVar15 = vminps_avx(auVar15,auVar142);
  auVar165 = vminps_avx(auVar165,auVar15);
  auVar96._0_4_ = auVar165._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar165._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar165._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar165._12_4_ * 1.0000004;
  auVar122[4] = PVar9;
  auVar122._5_3_ = 0;
  auVar122[8] = PVar9;
  auVar122._9_3_ = 0;
  auVar122[0xc] = PVar9;
  auVar122._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar122,_DAT_01f4ad30);
  auVar165 = vcmpps_avx(local_280,auVar96,2);
  auVar165 = vandps_avx(auVar165,auVar15);
  uVar90 = vmovmskps_avx(auVar165);
  uVar91 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar90);
  local_540[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_540[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_540[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_540[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_688 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pPVar88 = prim + uVar85 * 0x19 + 0x16;
  do {
    auVar100 = local_460;
    if (uVar91 == 0) {
      return;
    }
    lVar87 = 0;
    for (uVar85 = uVar91; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      lVar87 = lVar87 + 1;
    }
    uVar91 = uVar91 - 1 & uVar91;
    uVar83 = *(uint *)(prim + lVar87 * 4 + 6);
    uVar85 = (ulong)(uint)((int)lVar87 << 6);
    uVar10 = *(uint *)(prim + 2);
    pGVar12 = (context->scene->geometries).items[uVar10].ptr;
    pPVar1 = pPVar88 + uVar85;
    uVar78 = *(undefined8 *)pPVar1;
    uVar79 = *(undefined8 *)(pPVar1 + 8);
    auVar16 = *(undefined1 (*) [16])pPVar1;
    auVar15 = *(undefined1 (*) [16])pPVar1;
    auVar165 = *(undefined1 (*) [16])pPVar1;
    if (uVar91 != 0) {
      uVar86 = uVar91 - 1 & uVar91;
      for (uVar20 = uVar91; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
      }
      if (uVar86 != 0) {
        for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar17 = *(undefined1 (*) [16])(pPVar88 + uVar85 + 0x10);
    auVar18 = *(undefined1 (*) [16])(pPVar88 + uVar85 + 0x20);
    auVar168 = *(undefined1 (*) [16])(pPVar88 + uVar85 + 0x30);
    iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar142 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar95 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar142);
    uVar90 = auVar95._0_4_;
    auVar162._4_4_ = uVar90;
    auVar162._0_4_ = uVar90;
    auVar162._8_4_ = uVar90;
    auVar162._12_4_ = uVar90;
    auVar96 = vshufps_avx(auVar95,auVar95,0x55);
    auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    fVar141 = pre->ray_space[k].vz.field_0.m128[0];
    fVar110 = pre->ray_space[k].vz.field_0.m128[1];
    fVar112 = pre->ray_space[k].vz.field_0.m128[2];
    fVar114 = pre->ray_space[k].vz.field_0.m128[3];
    auVar183._0_4_ = fVar141 * auVar95._0_4_;
    auVar183._4_4_ = fVar110 * auVar95._4_4_;
    auVar183._8_4_ = fVar112 * auVar95._8_4_;
    auVar183._12_4_ = fVar114 * auVar95._12_4_;
    auVar96 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar7,auVar96);
    auVar122 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar6,auVar162);
    auVar96 = vblendps_avx(auVar122,*(undefined1 (*) [16])pPVar1,8);
    auVar121 = vsubps_avx(auVar17,auVar142);
    uVar90 = auVar121._0_4_;
    auVar184._4_4_ = uVar90;
    auVar184._0_4_ = uVar90;
    auVar184._8_4_ = uVar90;
    auVar184._12_4_ = uVar90;
    auVar95 = vshufps_avx(auVar121,auVar121,0x55);
    auVar121 = vshufps_avx(auVar121,auVar121,0xaa);
    auVar216._0_4_ = fVar141 * auVar121._0_4_;
    auVar216._4_4_ = fVar110 * auVar121._4_4_;
    auVar216._8_4_ = fVar112 * auVar121._8_4_;
    auVar216._12_4_ = fVar114 * auVar121._12_4_;
    auVar95 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar7,auVar95);
    auVar157 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar6,auVar184);
    auVar95 = vblendps_avx(auVar157,auVar17,8);
    auVar94 = vsubps_avx(auVar18,auVar142);
    uVar90 = auVar94._0_4_;
    auVar191._4_4_ = uVar90;
    auVar191._0_4_ = uVar90;
    auVar191._8_4_ = uVar90;
    auVar191._12_4_ = uVar90;
    auVar121 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar221._0_4_ = fVar141 * auVar94._0_4_;
    auVar221._4_4_ = fVar110 * auVar94._4_4_;
    auVar221._8_4_ = fVar112 * auVar94._8_4_;
    auVar221._12_4_ = fVar114 * auVar94._12_4_;
    auVar121 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar7,auVar121);
    auVar161 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar6,auVar191);
    auVar121 = vblendps_avx(auVar161,auVar18,8);
    auVar94 = vsubps_avx(auVar168,auVar142);
    uVar90 = auVar94._0_4_;
    auVar192._4_4_ = uVar90;
    auVar192._0_4_ = uVar90;
    auVar192._8_4_ = uVar90;
    auVar192._12_4_ = uVar90;
    auVar142 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar223._0_4_ = fVar141 * auVar94._0_4_;
    auVar223._4_4_ = fVar110 * auVar94._4_4_;
    auVar223._8_4_ = fVar112 * auVar94._8_4_;
    auVar223._12_4_ = fVar114 * auVar94._12_4_;
    auVar142 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar7,auVar142);
    auVar93 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar6,auVar192);
    auVar142 = vblendps_avx(auVar93,auVar168,8);
    auVar96 = vandps_avx(auVar96,local_270);
    auVar95 = vandps_avx(auVar95,local_270);
    auVar94 = vmaxps_avx(auVar96,auVar95);
    auVar96 = vandps_avx(auVar121,local_270);
    auVar95 = vandps_avx(auVar142,local_270);
    auVar96 = vmaxps_avx(auVar96,auVar95);
    auVar96 = vmaxps_avx(auVar94,auVar96);
    auVar95 = vmovshdup_avx(auVar96);
    auVar95 = vmaxss_avx(auVar95,auVar96);
    auVar96 = vshufpd_avx(auVar96,auVar96,1);
    auVar96 = vmaxss_avx(auVar96,auVar95);
    lVar87 = (long)iVar11 * 0x44;
    auVar95 = vmovshdup_avx(auVar122);
    uVar92 = auVar95._0_8_;
    local_440._8_8_ = uVar92;
    local_440._0_8_ = uVar92;
    local_440._16_8_ = uVar92;
    local_440._24_8_ = uVar92;
    auVar121 = vmovshdup_avx(auVar157);
    uVar92 = auVar121._0_8_;
    local_4a0._8_8_ = uVar92;
    local_4a0._0_8_ = uVar92;
    local_4a0._16_8_ = uVar92;
    local_4a0._24_8_ = uVar92;
    auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x908);
    uVar220 = auVar161._0_4_;
    local_560._4_4_ = uVar220;
    local_560._0_4_ = uVar220;
    local_560._8_4_ = uVar220;
    local_560._12_4_ = uVar220;
    local_560._16_4_ = uVar220;
    local_560._20_4_ = uVar220;
    local_560._24_4_ = uVar220;
    local_560._28_4_ = uVar220;
    auVar121 = vmovshdup_avx(auVar161);
    uVar92 = auVar121._0_8_;
    local_720._8_8_ = uVar92;
    local_720._0_8_ = uVar92;
    local_720._16_8_ = uVar92;
    local_720._24_8_ = uVar92;
    fVar141 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar87 + 0xd8c);
    auVar81 = *(undefined1 (*) [28])(bspline_basis0 + lVar87 + 0xd8c);
    local_600 = auVar93._0_4_;
    auVar121 = vmovshdup_avx(auVar93);
    uVar92 = auVar121._0_8_;
    auVar8._4_4_ = local_600 * *(float *)(bspline_basis0 + lVar87 + 0xd90);
    auVar8._0_4_ = local_600 * fVar141;
    auVar8._8_4_ = local_600 * *(float *)(bspline_basis0 + lVar87 + 0xd94);
    auVar8._12_4_ = local_600 * *(float *)(bspline_basis0 + lVar87 + 0xd98);
    auVar8._16_4_ = local_600 * *(float *)(bspline_basis0 + lVar87 + 0xd9c);
    auVar8._20_4_ = local_600 * *(float *)(bspline_basis0 + lVar87 + 0xda0);
    auVar8._24_4_ = local_600 * *(float *)(bspline_basis0 + lVar87 + 0xda4);
    auVar8._28_4_ = *(undefined4 *)(bspline_basis0 + lVar87 + 0xda8);
    auVar142 = vfmadd231ps_fma(auVar8,auVar109,local_560);
    local_640 = auVar121._0_4_;
    auVar106._0_4_ = local_640 * fVar141;
    fStack_63c = auVar121._4_4_;
    auVar106._4_4_ = fStack_63c * *(float *)(bspline_basis0 + lVar87 + 0xd90);
    auVar106._8_4_ = local_640 * *(float *)(bspline_basis0 + lVar87 + 0xd94);
    auVar106._12_4_ = fStack_63c * *(float *)(bspline_basis0 + lVar87 + 0xd98);
    auVar106._16_4_ = local_640 * *(float *)(bspline_basis0 + lVar87 + 0xd9c);
    auVar106._20_4_ = fStack_63c * *(float *)(bspline_basis0 + lVar87 + 0xda0);
    auVar106._24_4_ = local_640 * *(float *)(bspline_basis0 + lVar87 + 0xda4);
    auVar106._28_4_ = 0;
    auVar121 = vfmadd231ps_fma(auVar106,auVar109,local_720);
    auVar8 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x484);
    uVar90 = auVar157._0_4_;
    local_5e0._4_4_ = uVar90;
    local_5e0._0_4_ = uVar90;
    local_5e0._8_4_ = uVar90;
    local_5e0._12_4_ = uVar90;
    local_5e0._16_4_ = uVar90;
    local_5e0._20_4_ = uVar90;
    local_5e0._24_4_ = uVar90;
    local_5e0._28_4_ = uVar90;
    auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar8,local_5e0);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar8,local_4a0);
    auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar87);
    local_780._0_4_ = auVar122._0_4_;
    local_7a0._4_4_ = local_780._0_4_;
    local_7a0._0_4_ = local_780._0_4_;
    local_7a0._8_4_ = local_780._0_4_;
    local_7a0._12_4_ = local_780._0_4_;
    local_7a0._16_4_ = local_780._0_4_;
    local_7a0._20_4_ = local_780._0_4_;
    local_7a0._24_4_ = local_780._0_4_;
    local_7a0._28_4_ = local_780._0_4_;
    auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar106,local_7a0);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar106,local_440);
    auVar154 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x908);
    fVar141 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar87 + 0xd8c);
    fVar110 = *(float *)(bspline_basis1 + lVar87 + 0xd90);
    fVar112 = *(float *)(bspline_basis1 + lVar87 + 0xd94);
    fVar114 = *(float *)(bspline_basis1 + lVar87 + 0xd98);
    fVar68 = *(float *)(bspline_basis1 + lVar87 + 0xd9c);
    fVar140 = *(float *)(bspline_basis1 + lVar87 + 0xda0);
    fVar111 = *(float *)(bspline_basis1 + lVar87 + 0xda4);
    auVar82 = *(undefined1 (*) [28])(bspline_basis1 + lVar87 + 0xd8c);
    auVar104._4_4_ = local_600 * fVar110;
    auVar104._0_4_ = local_600 * fVar141;
    auVar104._8_4_ = local_600 * fVar112;
    auVar104._12_4_ = local_600 * fVar114;
    auVar104._16_4_ = local_600 * fVar68;
    auVar104._20_4_ = local_600 * fVar140;
    auVar104._24_4_ = local_600 * fVar111;
    auVar104._28_4_ = *(undefined4 *)(bspline_basis0 + lVar87 + 0xda8);
    auVar94 = vfmadd231ps_fma(auVar104,auVar154,local_560);
    auVar130._4_4_ = fStack_63c * fVar110;
    auVar130._0_4_ = local_640 * fVar141;
    auVar130._8_4_ = local_640 * fVar112;
    auVar130._12_4_ = fStack_63c * fVar114;
    auVar130._16_4_ = local_640 * fVar68;
    auVar130._20_4_ = fStack_63c * fVar140;
    auVar130._24_4_ = local_640 * fVar111;
    auVar130._28_4_ = uVar220;
    auVar120 = vfmadd231ps_fma(auVar130,auVar154,local_720);
    auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x484);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar104,local_5e0);
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar104,local_4a0);
    auVar130 = *(undefined1 (*) [32])(bspline_basis1 + lVar87);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar130,local_7a0);
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar130,local_440);
    auVar98 = ZEXT1632(auVar94);
    auVar125 = ZEXT1632(auVar142);
    _local_320 = vsubps_avx(auVar98,auVar125);
    local_2c0 = ZEXT1632(auVar120);
    _local_2e0 = ZEXT1632(auVar121);
    auVar19 = vsubps_avx(local_2c0,_local_2e0);
    auVar99._0_4_ = auVar121._0_4_ * local_320._0_4_;
    auVar99._4_4_ = auVar121._4_4_ * local_320._4_4_;
    auVar99._8_4_ = auVar121._8_4_ * local_320._8_4_;
    auVar99._12_4_ = auVar121._12_4_ * local_320._12_4_;
    auVar99._16_4_ = local_320._16_4_ * 0.0;
    auVar99._20_4_ = local_320._20_4_ * 0.0;
    auVar99._24_4_ = local_320._24_4_ * 0.0;
    auVar99._28_4_ = 0;
    fVar116 = auVar19._0_4_;
    auVar126._0_4_ = fVar116 * auVar142._0_4_;
    fVar117 = auVar19._4_4_;
    auVar126._4_4_ = fVar117 * auVar142._4_4_;
    fVar118 = auVar19._8_4_;
    auVar126._8_4_ = fVar118 * auVar142._8_4_;
    fVar207 = auVar19._12_4_;
    auVar126._12_4_ = fVar207 * auVar142._12_4_;
    fVar209 = auVar19._16_4_;
    auVar126._16_4_ = fVar209 * 0.0;
    fVar211 = auVar19._20_4_;
    auVar126._20_4_ = fVar211 * 0.0;
    fVar213 = auVar19._24_4_;
    auVar126._24_4_ = fVar213 * 0.0;
    auVar126._28_4_ = 0;
    auVar99 = vsubps_avx(auVar99,auVar126);
    auVar121 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar119 = auVar121._0_8_;
    local_80._8_8_ = uVar119;
    local_80._0_8_ = uVar119;
    local_80._16_8_ = uVar119;
    local_80._24_8_ = uVar119;
    auVar142 = vpermilps_avx(auVar17,0xff);
    uVar119 = auVar142._0_8_;
    local_a0._8_8_ = uVar119;
    local_a0._0_8_ = uVar119;
    local_a0._16_8_ = uVar119;
    local_a0._24_8_ = uVar119;
    auVar142 = vpermilps_avx(auVar18,0xff);
    uVar119 = auVar142._0_8_;
    local_c0._8_8_ = uVar119;
    local_c0._0_8_ = uVar119;
    local_c0._16_8_ = uVar119;
    local_c0._24_8_ = uVar119;
    auVar142 = vpermilps_avx(auVar168,0xff);
    local_e0 = auVar142._0_8_;
    local_860 = auVar81._0_4_;
    fStack_85c = auVar81._4_4_;
    fStack_858 = auVar81._8_4_;
    fStack_854 = auVar81._12_4_;
    fStack_850 = auVar81._16_4_;
    fStack_84c = auVar81._20_4_;
    fStack_848 = auVar81._24_4_;
    fVar113 = auVar142._0_4_;
    fVar115 = auVar142._4_4_;
    auVar105._4_4_ = fVar115 * fStack_85c;
    auVar105._0_4_ = fVar113 * local_860;
    auVar105._8_4_ = fVar113 * fStack_858;
    auVar105._12_4_ = fVar115 * fStack_854;
    auVar105._16_4_ = fVar113 * fStack_850;
    auVar105._20_4_ = fVar115 * fStack_84c;
    auVar105._24_4_ = fVar113 * fStack_848;
    auVar105._28_4_ = auVar95._4_4_;
    auVar95 = vfmadd231ps_fma(auVar105,local_c0,auVar109);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar8,local_a0);
    auVar142 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,local_80);
    auVar188 = ZEXT1664(auVar142);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar134._4_4_ = fVar110 * fVar115;
    auVar134._0_4_ = fVar141 * fVar113;
    auVar134._8_4_ = fVar112 * fVar113;
    auVar134._12_4_ = fVar114 * fVar115;
    auVar134._16_4_ = fVar68 * fVar113;
    auVar134._20_4_ = fVar140 * fVar115;
    auVar134._24_4_ = fVar111 * fVar113;
    auVar134._28_4_ = auVar106._28_4_;
    auVar95 = vfmadd231ps_fma(auVar134,auVar154,local_c0);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar104,local_a0);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar130,local_80);
    auVar153._4_4_ = fVar117 * fVar117;
    auVar153._0_4_ = fVar116 * fVar116;
    auVar153._8_4_ = fVar118 * fVar118;
    auVar153._12_4_ = fVar207 * fVar207;
    auVar153._16_4_ = fVar209 * fVar209;
    auVar153._20_4_ = fVar211 * fVar211;
    auVar153._24_4_ = fVar213 * fVar213;
    auVar153._28_4_ = auVar121._4_4_;
    auVar95 = vfmadd231ps_fma(auVar153,_local_320,_local_320);
    auVar105 = vmaxps_avx(ZEXT1632(auVar142),ZEXT1632(auVar94));
    auVar186._4_4_ = auVar105._4_4_ * auVar105._4_4_ * auVar95._4_4_;
    auVar186._0_4_ = auVar105._0_4_ * auVar105._0_4_ * auVar95._0_4_;
    auVar186._8_4_ = auVar105._8_4_ * auVar105._8_4_ * auVar95._8_4_;
    auVar186._12_4_ = auVar105._12_4_ * auVar105._12_4_ * auVar95._12_4_;
    auVar186._16_4_ = auVar105._16_4_ * auVar105._16_4_ * 0.0;
    auVar186._20_4_ = auVar105._20_4_ * auVar105._20_4_ * 0.0;
    auVar186._24_4_ = auVar105._24_4_ * auVar105._24_4_ * 0.0;
    auVar186._28_4_ = auVar105._28_4_;
    auVar228._4_4_ = auVar99._4_4_ * auVar99._4_4_;
    auVar228._0_4_ = auVar99._0_4_ * auVar99._0_4_;
    auVar228._8_4_ = auVar99._8_4_ * auVar99._8_4_;
    auVar228._12_4_ = auVar99._12_4_ * auVar99._12_4_;
    auVar228._16_4_ = auVar99._16_4_ * auVar99._16_4_;
    auVar228._20_4_ = auVar99._20_4_ * auVar99._20_4_;
    auVar228._24_4_ = auVar99._24_4_ * auVar99._24_4_;
    auVar228._28_4_ = auVar99._28_4_;
    local_460._0_4_ = (undefined4)iVar11;
    local_460._4_12_ = auVar93._4_12_;
    auVar105 = vcmpps_avx(auVar228,auVar186,2);
    fVar141 = auVar96._0_4_ * 4.7683716e-07;
    local_460._16_16_ = auVar100._16_16_;
    auVar100._4_4_ = local_460._0_4_;
    auVar100._0_4_ = local_460._0_4_;
    auVar100._8_4_ = local_460._0_4_;
    auVar100._12_4_ = local_460._0_4_;
    auVar100._16_4_ = local_460._0_4_;
    auVar100._20_4_ = local_460._0_4_;
    auVar100._24_4_ = local_460._0_4_;
    auVar100._28_4_ = local_460._0_4_;
    auVar100 = vcmpps_avx(_DAT_01f7b060,auVar100,1);
    auVar96 = vpermilps_avx(auVar122,0xaa);
    uVar119 = auVar96._0_8_;
    auVar222._8_8_ = uVar119;
    auVar222._0_8_ = uVar119;
    auVar222._16_8_ = uVar119;
    auVar222._24_8_ = uVar119;
    auVar95 = vpermilps_avx(auVar157,0xaa);
    uVar119 = auVar95._0_8_;
    local_6c0._8_8_ = uVar119;
    local_6c0._0_8_ = uVar119;
    local_6c0._16_8_ = uVar119;
    local_6c0._24_8_ = uVar119;
    auVar229 = ZEXT3264(local_6c0);
    auVar121 = vpermilps_avx(auVar161,0xaa);
    uVar119 = auVar121._0_8_;
    auVar217._8_8_ = uVar119;
    auVar217._0_8_ = uVar119;
    auVar217._16_8_ = uVar119;
    auVar217._24_8_ = uVar119;
    auVar96 = vshufps_avx(auVar93,auVar93,0xaa);
    uVar119 = auVar96._0_8_;
    register0x00001508 = uVar119;
    local_6e0 = uVar119;
    register0x00001510 = uVar119;
    register0x00001518 = uVar119;
    auVar226 = ZEXT3264(_local_6e0);
    auVar99 = auVar100 & auVar105;
    uVar5 = *(uint *)(ray + k * 4 + 0x30);
    local_680._0_16_ = ZEXT416(uVar5);
    local_4c0._0_16_ = ZEXT416(uVar10);
    local_480._0_16_ = ZEXT416(uVar83);
    local_7c0 = auVar17._0_8_;
    uStack_7b8 = auVar17._8_8_;
    local_7d0 = auVar18._0_8_;
    uStack_7c8 = auVar18._8_8_;
    local_7e0._0_4_ = auVar168._0_4_;
    fVar110 = (float)local_7e0;
    local_7e0._4_4_ = auVar168._4_4_;
    fVar112 = local_7e0._4_4_;
    uStack_7d8._0_4_ = auVar168._8_4_;
    fVar114 = (float)uStack_7d8;
    uStack_7d8._4_4_ = auVar168._12_4_;
    fVar68 = uStack_7d8._4_4_;
    local_7e0 = auVar168._0_8_;
    uStack_7d8 = auVar168._8_8_;
    fStack_638 = local_640;
    fStack_634 = fStack_63c;
    fStack_630 = local_640;
    fStack_62c = fStack_63c;
    fStack_628 = local_640;
    fStack_624 = fStack_63c;
    fStack_5fc = local_600;
    fStack_5f8 = local_600;
    fStack_5f4 = local_600;
    fStack_5f0 = local_600;
    fStack_5ec = local_600;
    fStack_5e8 = local_600;
    fStack_5e4 = local_600;
    if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar99 >> 0x7f,0) == '\0') &&
          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar99 >> 0xbf,0) == '\0') &&
        (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar99[0x1f]) {
      auVar139 = ZEXT3264(local_660);
      auVar160 = ZEXT3264(local_560);
      auVar197 = ZEXT3264(local_720);
      auVar204 = ZEXT3264(CONCAT428(fStack_63c,
                                    CONCAT424(local_640,
                                              CONCAT420(fStack_63c,
                                                        CONCAT416(local_640,
                                                                  CONCAT412(fStack_63c,
                                                                            CONCAT48(local_640,
                                                                                     uVar92)))))));
      auVar156 = ZEXT3264(local_5e0);
      auVar235 = ZEXT3264(local_7a0);
    }
    else {
      local_500 = SUB84(pGVar12,0);
      uStack_4fc = (undefined4)((ulong)pGVar12 >> 0x20);
      local_300 = vandps_avx(auVar105,auVar100);
      local_5c0._0_4_ = auVar82._0_4_;
      local_5c0._4_4_ = auVar82._4_4_;
      fStack_5b8 = auVar82._8_4_;
      fStack_5b4 = auVar82._12_4_;
      fStack_5b0 = auVar82._16_4_;
      fStack_5ac = auVar82._20_4_;
      fStack_5a8 = auVar82._24_4_;
      fVar207 = auVar96._0_4_;
      fVar209 = auVar96._4_4_;
      auVar193._4_4_ = fVar209 * (float)local_5c0._4_4_;
      auVar193._0_4_ = fVar207 * (float)local_5c0._0_4_;
      auVar193._8_4_ = fVar207 * fStack_5b8;
      auVar193._12_4_ = fVar209 * fStack_5b4;
      auVar193._16_4_ = fVar207 * fStack_5b0;
      auVar193._20_4_ = fVar209 * fStack_5ac;
      auVar193._24_4_ = fVar207 * fStack_5a8;
      auVar193._28_4_ = local_300._28_4_;
      auVar168 = vfmadd213ps_fma(auVar154,auVar217,auVar193);
      auVar168 = vfmadd213ps_fma(auVar104,local_6c0,ZEXT1632(auVar168));
      auVar168 = vfmadd213ps_fma(auVar130,auVar222,ZEXT1632(auVar168));
      _local_5c0 = ZEXT1632(auVar168);
      auVar154._4_4_ = fVar209 * fStack_85c;
      auVar154._0_4_ = fVar207 * local_860;
      auVar154._8_4_ = fVar207 * fStack_858;
      auVar154._12_4_ = fVar209 * fStack_854;
      auVar154._16_4_ = fVar207 * fStack_850;
      auVar154._20_4_ = fVar209 * fStack_84c;
      auVar154._24_4_ = fVar207 * fStack_848;
      auVar154._28_4_ = local_300._28_4_;
      auVar168 = vfmadd213ps_fma(auVar109,auVar217,auVar154);
      auVar168 = vfmadd213ps_fma(auVar8,local_6c0,ZEXT1632(auVar168));
      auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x1210);
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x1694);
      auVar8 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x1b18);
      fVar140 = *(float *)(bspline_basis0 + lVar87 + 0x1f9c);
      fVar111 = *(float *)(bspline_basis0 + lVar87 + 0x1fa0);
      fVar113 = *(float *)(bspline_basis0 + lVar87 + 0x1fa4);
      fVar115 = *(float *)(bspline_basis0 + lVar87 + 0x1fa8);
      fVar116 = *(float *)(bspline_basis0 + lVar87 + 0x1fac);
      fVar117 = *(float *)(bspline_basis0 + lVar87 + 0x1fb0);
      fVar118 = *(float *)(bspline_basis0 + lVar87 + 0x1fb4);
      auVar176._0_4_ = local_600 * fVar140;
      auVar176._4_4_ = local_600 * fVar111;
      auVar176._8_4_ = local_600 * fVar113;
      auVar176._12_4_ = local_600 * fVar115;
      auVar176._16_4_ = local_600 * fVar116;
      auVar176._20_4_ = local_600 * fVar117;
      auVar176._24_4_ = local_600 * fVar118;
      auVar176._28_4_ = 0;
      auVar195._0_4_ = local_640 * fVar140;
      auVar195._4_4_ = fStack_63c * fVar111;
      auVar195._8_4_ = local_640 * fVar113;
      auVar195._12_4_ = fStack_63c * fVar115;
      auVar195._16_4_ = local_640 * fVar116;
      auVar195._20_4_ = fStack_63c * fVar117;
      auVar195._24_4_ = local_640 * fVar118;
      auVar195._28_4_ = 0;
      auVar21._4_4_ = fVar111 * fVar209;
      auVar21._0_4_ = fVar140 * fVar207;
      auVar21._8_4_ = fVar113 * fVar207;
      auVar21._12_4_ = fVar115 * fVar209;
      auVar21._16_4_ = fVar116 * fVar207;
      auVar21._20_4_ = fVar117 * fVar209;
      auVar21._24_4_ = fVar118 * fVar207;
      auVar21._28_4_ = auVar121._4_4_;
      auVar96 = vfmadd231ps_fma(auVar176,auVar8,local_560);
      auVar121 = vfmadd231ps_fma(auVar195,auVar8,local_720);
      auVar122 = vfmadd231ps_fma(auVar21,auVar217,auVar8);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar109,local_5e0);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar109,local_4a0);
      auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),local_6c0,auVar109);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar100,local_7a0);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar100,local_440);
      auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar100,auVar222);
      fVar140 = *(float *)(bspline_basis1 + lVar87 + 0x1f9c);
      fVar111 = *(float *)(bspline_basis1 + lVar87 + 0x1fa0);
      fVar113 = *(float *)(bspline_basis1 + lVar87 + 0x1fa4);
      fVar115 = *(float *)(bspline_basis1 + lVar87 + 0x1fa8);
      fVar116 = *(float *)(bspline_basis1 + lVar87 + 0x1fac);
      fVar117 = *(float *)(bspline_basis1 + lVar87 + 0x1fb0);
      fVar118 = *(float *)(bspline_basis1 + lVar87 + 0x1fb4);
      auVar109._4_4_ = local_600 * fVar111;
      auVar109._0_4_ = local_600 * fVar140;
      auVar109._8_4_ = local_600 * fVar113;
      auVar109._12_4_ = local_600 * fVar115;
      auVar109._16_4_ = local_600 * fVar116;
      auVar109._20_4_ = local_600 * fVar117;
      auVar109._24_4_ = local_600 * fVar118;
      auVar109._28_4_ = local_600;
      auVar22._4_4_ = fStack_63c * fVar111;
      auVar22._0_4_ = local_640 * fVar140;
      auVar22._8_4_ = local_640 * fVar113;
      auVar22._12_4_ = fStack_63c * fVar115;
      auVar22._16_4_ = local_640 * fVar116;
      auVar22._20_4_ = fStack_63c * fVar117;
      auVar22._24_4_ = local_640 * fVar118;
      auVar22._28_4_ = fStack_63c;
      auVar23._4_4_ = fVar111 * fVar209;
      auVar23._0_4_ = fVar140 * fVar207;
      auVar23._8_4_ = fVar113 * fVar207;
      auVar23._12_4_ = fVar115 * fVar209;
      auVar23._16_4_ = fVar116 * fVar207;
      auVar23._20_4_ = fVar117 * fVar209;
      auVar23._24_4_ = fVar118 * fVar207;
      auVar23._28_4_ = auVar95._4_4_;
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x1b18);
      auVar95 = vfmadd231ps_fma(auVar109,auVar100,local_560);
      auVar157 = vfmadd231ps_fma(auVar22,auVar100,local_720);
      auVar161 = vfmadd231ps_fma(auVar23,auVar217,auVar100);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x1694);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar100,local_5e0);
      auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar100,local_4a0);
      auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar100,local_6c0);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x1210);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar100,local_7a0);
      auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar100,local_440);
      auVar127._8_4_ = 0x7fffffff;
      auVar127._0_8_ = 0x7fffffff7fffffff;
      auVar127._12_4_ = 0x7fffffff;
      auVar127._16_4_ = 0x7fffffff;
      auVar127._20_4_ = 0x7fffffff;
      auVar127._24_4_ = 0x7fffffff;
      auVar127._28_4_ = 0x7fffffff;
      auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar222,auVar100);
      auVar100 = vandps_avx(ZEXT1632(auVar96),auVar127);
      auVar109 = vandps_avx(ZEXT1632(auVar121),auVar127);
      auVar109 = vmaxps_avx(auVar100,auVar109);
      auVar100 = vandps_avx(ZEXT1632(auVar122),auVar127);
      auVar100 = vmaxps_avx(auVar109,auVar100);
      auVar151._4_4_ = fVar141;
      auVar151._0_4_ = fVar141;
      auVar151._8_4_ = fVar141;
      auVar151._12_4_ = fVar141;
      auVar151._16_4_ = fVar141;
      auVar151._20_4_ = fVar141;
      auVar151._24_4_ = fVar141;
      auVar151._28_4_ = fVar141;
      auVar100 = vcmpps_avx(auVar100,auVar151,1);
      auVar8 = vblendvps_avx(ZEXT1632(auVar96),_local_320,auVar100);
      auVar154 = vblendvps_avx(ZEXT1632(auVar121),auVar19,auVar100);
      auVar100 = vandps_avx(ZEXT1632(auVar95),auVar127);
      auVar109 = vandps_avx(ZEXT1632(auVar157),auVar127);
      auVar104 = vmaxps_avx(auVar100,auVar109);
      auVar100 = vandps_avx(ZEXT1632(auVar161),auVar127);
      auVar100 = vmaxps_avx(auVar104,auVar100);
      auVar130 = vcmpps_avx(auVar100,auVar151,1);
      auVar100 = vblendvps_avx(ZEXT1632(auVar95),_local_320,auVar130);
      auVar104 = vblendvps_avx(ZEXT1632(auVar157),auVar19,auVar130);
      auVar168 = vfmadd213ps_fma(auVar106,auVar222,ZEXT1632(auVar168));
      auVar96 = vfmadd213ps_fma(auVar8,auVar8,ZEXT832(0) << 0x20);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar154,auVar154);
      auVar106 = vrsqrtps_avx(ZEXT1632(auVar96));
      fVar140 = auVar106._0_4_;
      fVar111 = auVar106._4_4_;
      fVar113 = auVar106._8_4_;
      fVar115 = auVar106._12_4_;
      fVar116 = auVar106._16_4_;
      fVar117 = auVar106._20_4_;
      fVar118 = auVar106._24_4_;
      auVar19._4_4_ = fVar111 * fVar111 * fVar111 * auVar96._4_4_ * -0.5;
      auVar19._0_4_ = fVar140 * fVar140 * fVar140 * auVar96._0_4_ * -0.5;
      auVar19._8_4_ = fVar113 * fVar113 * fVar113 * auVar96._8_4_ * -0.5;
      auVar19._12_4_ = fVar115 * fVar115 * fVar115 * auVar96._12_4_ * -0.5;
      auVar19._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
      auVar19._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar19._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
      auVar19._28_4_ = auVar109._28_4_;
      auVar233._8_4_ = 0x3fc00000;
      auVar233._0_8_ = 0x3fc000003fc00000;
      auVar233._12_4_ = 0x3fc00000;
      auVar233._16_4_ = 0x3fc00000;
      auVar233._20_4_ = 0x3fc00000;
      auVar233._24_4_ = 0x3fc00000;
      auVar233._28_4_ = 0x3fc00000;
      auVar96 = vfmadd231ps_fma(auVar19,auVar233,auVar106);
      fVar140 = auVar96._0_4_;
      fVar111 = auVar96._4_4_;
      auVar24._4_4_ = fVar111 * auVar154._4_4_;
      auVar24._0_4_ = fVar140 * auVar154._0_4_;
      fVar113 = auVar96._8_4_;
      auVar24._8_4_ = fVar113 * auVar154._8_4_;
      fVar115 = auVar96._12_4_;
      auVar24._12_4_ = fVar115 * auVar154._12_4_;
      auVar24._16_4_ = auVar154._16_4_ * 0.0;
      auVar24._20_4_ = auVar154._20_4_ * 0.0;
      auVar24._24_4_ = auVar154._24_4_ * 0.0;
      auVar24._28_4_ = 0;
      auVar25._4_4_ = fVar111 * -auVar8._4_4_;
      auVar25._0_4_ = fVar140 * -auVar8._0_4_;
      auVar25._8_4_ = fVar113 * -auVar8._8_4_;
      auVar25._12_4_ = fVar115 * -auVar8._12_4_;
      auVar25._16_4_ = -auVar8._16_4_ * 0.0;
      auVar25._20_4_ = -auVar8._20_4_ * 0.0;
      auVar25._24_4_ = -auVar8._24_4_ * 0.0;
      auVar25._28_4_ = auVar106._28_4_;
      auVar96 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar104,auVar104);
      auVar109 = vrsqrtps_avx(ZEXT1632(auVar96));
      auVar26._28_4_ = auVar130._28_4_;
      auVar26._0_28_ =
           ZEXT1628(CONCAT412(fVar115 * 0.0,
                              CONCAT48(fVar113 * 0.0,CONCAT44(fVar111 * 0.0,fVar140 * 0.0))));
      fVar140 = auVar109._0_4_;
      fVar111 = auVar109._4_4_;
      fVar113 = auVar109._8_4_;
      fVar115 = auVar109._12_4_;
      fVar116 = auVar109._16_4_;
      fVar117 = auVar109._20_4_;
      fVar118 = auVar109._24_4_;
      auVar27._4_4_ = fVar111 * fVar111 * fVar111 * auVar96._4_4_ * -0.5;
      auVar27._0_4_ = fVar140 * fVar140 * fVar140 * auVar96._0_4_ * -0.5;
      auVar27._8_4_ = fVar113 * fVar113 * fVar113 * auVar96._8_4_ * -0.5;
      auVar27._12_4_ = fVar115 * fVar115 * fVar115 * auVar96._12_4_ * -0.5;
      auVar27._16_4_ = fVar116 * fVar116 * fVar116 * -0.0;
      auVar27._20_4_ = fVar117 * fVar117 * fVar117 * -0.0;
      auVar27._24_4_ = fVar118 * fVar118 * fVar118 * -0.0;
      auVar27._28_4_ = 0;
      auVar96 = vfmadd231ps_fma(auVar27,auVar233,auVar109);
      fVar140 = auVar96._0_4_;
      auVar218._0_4_ = auVar104._0_4_ * fVar140;
      fVar111 = auVar96._4_4_;
      auVar218._4_4_ = auVar104._4_4_ * fVar111;
      fVar113 = auVar96._8_4_;
      auVar218._8_4_ = auVar104._8_4_ * fVar113;
      fVar115 = auVar96._12_4_;
      auVar218._12_4_ = auVar104._12_4_ * fVar115;
      auVar218._16_4_ = auVar104._16_4_ * 0.0;
      auVar218._20_4_ = auVar104._20_4_ * 0.0;
      auVar218._24_4_ = auVar104._24_4_ * 0.0;
      auVar218._28_4_ = 0;
      auVar28._4_4_ = -auVar100._4_4_ * fVar111;
      auVar28._0_4_ = -auVar100._0_4_ * fVar140;
      auVar28._8_4_ = -auVar100._8_4_ * fVar113;
      auVar28._12_4_ = -auVar100._12_4_ * fVar115;
      auVar28._16_4_ = -auVar100._16_4_ * 0.0;
      auVar28._20_4_ = -auVar100._20_4_ * 0.0;
      auVar28._24_4_ = -auVar100._24_4_ * 0.0;
      auVar28._28_4_ = auVar104._28_4_;
      auVar29._28_4_ = auVar109._28_4_;
      auVar29._0_28_ =
           ZEXT1628(CONCAT412(fVar115 * 0.0,
                              CONCAT48(fVar113 * 0.0,CONCAT44(fVar111 * 0.0,fVar140 * 0.0))));
      auVar96 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar142),auVar125);
      auVar100 = ZEXT1632(auVar142);
      auVar95 = vfmadd213ps_fma(auVar25,auVar100,_local_2e0);
      auVar121 = vfmadd213ps_fma(auVar26,auVar100,ZEXT1632(auVar168));
      auVar161 = vfnmadd213ps_fma(auVar24,auVar100,auVar125);
      auVar122 = vfmadd213ps_fma(auVar218,ZEXT1632(auVar94),auVar98);
      auVar93 = vfnmadd213ps_fma(auVar25,auVar100,_local_2e0);
      auVar193 = ZEXT1632(auVar94);
      auVar94 = vfmadd213ps_fma(auVar28,auVar193,local_2c0);
      auVar126 = ZEXT1632(auVar142);
      auVar180 = vfnmadd231ps_fma(ZEXT1632(auVar168),auVar126,auVar26);
      auVar142 = vfmadd213ps_fma(auVar29,auVar193,_local_5c0);
      auVar120 = vfnmadd213ps_fma(auVar218,auVar193,auVar98);
      auVar175 = vfnmadd213ps_fma(auVar28,auVar193,local_2c0);
      auVar181 = vfnmadd231ps_fma(_local_5c0,auVar193,auVar29);
      auVar100 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93));
      auVar109 = vsubps_avx(ZEXT1632(auVar142),ZEXT1632(auVar180));
      auVar98._4_4_ = auVar180._4_4_ * auVar100._4_4_;
      auVar98._0_4_ = auVar180._0_4_ * auVar100._0_4_;
      auVar98._8_4_ = auVar180._8_4_ * auVar100._8_4_;
      auVar98._12_4_ = auVar180._12_4_ * auVar100._12_4_;
      auVar98._16_4_ = auVar100._16_4_ * 0.0;
      auVar98._20_4_ = auVar100._20_4_ * 0.0;
      auVar98._24_4_ = auVar100._24_4_ * 0.0;
      auVar98._28_4_ = 0;
      auVar157 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar93),auVar109);
      auVar125._4_4_ = auVar109._4_4_ * auVar161._4_4_;
      auVar125._0_4_ = auVar109._0_4_ * auVar161._0_4_;
      auVar125._8_4_ = auVar109._8_4_ * auVar161._8_4_;
      auVar125._12_4_ = auVar109._12_4_ * auVar161._12_4_;
      auVar125._16_4_ = auVar109._16_4_ * 0.0;
      auVar125._20_4_ = auVar109._20_4_ * 0.0;
      auVar125._24_4_ = auVar109._24_4_ * 0.0;
      auVar125._28_4_ = auVar109._28_4_;
      auVar109 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar161));
      auVar168 = vfmsub231ps_fma(auVar125,ZEXT1632(auVar180),auVar109);
      auVar30._4_4_ = auVar93._4_4_ * auVar109._4_4_;
      auVar30._0_4_ = auVar93._0_4_ * auVar109._0_4_;
      auVar30._8_4_ = auVar93._8_4_ * auVar109._8_4_;
      auVar30._12_4_ = auVar93._12_4_ * auVar109._12_4_;
      auVar30._16_4_ = auVar109._16_4_ * 0.0;
      auVar30._20_4_ = auVar109._20_4_ * 0.0;
      auVar30._24_4_ = auVar109._24_4_ * 0.0;
      auVar30._28_4_ = auVar109._28_4_;
      auVar130 = ZEXT1632(auVar161);
      auVar161 = vfmsub231ps_fma(auVar30,auVar130,auVar100);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar161),ZEXT832(0) << 0x20,ZEXT1632(auVar168));
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),ZEXT832(0) << 0x20,ZEXT1632(auVar157));
      auVar99 = vcmpps_avx(ZEXT1632(auVar168),ZEXT832(0) << 0x20,2);
      auVar100 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar96),auVar99);
      auVar109 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar95),auVar99);
      auVar8 = vblendvps_avx(ZEXT1632(auVar181),ZEXT1632(auVar121),auVar99);
      auVar106 = vblendvps_avx(auVar130,ZEXT1632(auVar122),auVar99);
      auVar154 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar94),auVar99);
      auVar188 = ZEXT3264(auVar154);
      auVar104 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar142),auVar99);
      auVar130 = vblendvps_avx(ZEXT1632(auVar122),auVar130,auVar99);
      auVar105 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93),auVar99);
      auVar168 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
      auVar19 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar180),auVar99);
      auVar134 = vsubps_avx(auVar130,auVar100);
      auVar153 = vsubps_avx(auVar105,auVar109);
      auVar186 = vsubps_avx(auVar19,auVar8);
      auVar228 = vsubps_avx(auVar100,auVar106);
      auVar98 = vsubps_avx(auVar109,auVar154);
      auVar125 = vsubps_avx(auVar8,auVar104);
      auVar31._4_4_ = auVar186._4_4_ * auVar100._4_4_;
      auVar31._0_4_ = auVar186._0_4_ * auVar100._0_4_;
      auVar31._8_4_ = auVar186._8_4_ * auVar100._8_4_;
      auVar31._12_4_ = auVar186._12_4_ * auVar100._12_4_;
      auVar31._16_4_ = auVar186._16_4_ * auVar100._16_4_;
      auVar31._20_4_ = auVar186._20_4_ * auVar100._20_4_;
      auVar31._24_4_ = auVar186._24_4_ * auVar100._24_4_;
      auVar31._28_4_ = auVar19._28_4_;
      auVar96 = vfmsub231ps_fma(auVar31,auVar8,auVar134);
      auVar32._4_4_ = auVar134._4_4_ * auVar109._4_4_;
      auVar32._0_4_ = auVar134._0_4_ * auVar109._0_4_;
      auVar32._8_4_ = auVar134._8_4_ * auVar109._8_4_;
      auVar32._12_4_ = auVar134._12_4_ * auVar109._12_4_;
      auVar32._16_4_ = auVar134._16_4_ * auVar109._16_4_;
      auVar32._20_4_ = auVar134._20_4_ * auVar109._20_4_;
      auVar32._24_4_ = auVar134._24_4_ * auVar109._24_4_;
      auVar32._28_4_ = auVar130._28_4_;
      auVar95 = vfmsub231ps_fma(auVar32,auVar100,auVar153);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
      auVar101._0_4_ = auVar153._0_4_ * auVar8._0_4_;
      auVar101._4_4_ = auVar153._4_4_ * auVar8._4_4_;
      auVar101._8_4_ = auVar153._8_4_ * auVar8._8_4_;
      auVar101._12_4_ = auVar153._12_4_ * auVar8._12_4_;
      auVar101._16_4_ = auVar153._16_4_ * auVar8._16_4_;
      auVar101._20_4_ = auVar153._20_4_ * auVar8._20_4_;
      auVar101._24_4_ = auVar153._24_4_ * auVar8._24_4_;
      auVar101._28_4_ = 0;
      auVar95 = vfmsub231ps_fma(auVar101,auVar109,auVar186);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar95));
      auVar102._0_4_ = auVar125._0_4_ * auVar106._0_4_;
      auVar102._4_4_ = auVar125._4_4_ * auVar106._4_4_;
      auVar102._8_4_ = auVar125._8_4_ * auVar106._8_4_;
      auVar102._12_4_ = auVar125._12_4_ * auVar106._12_4_;
      auVar102._16_4_ = auVar125._16_4_ * auVar106._16_4_;
      auVar102._20_4_ = auVar125._20_4_ * auVar106._20_4_;
      auVar102._24_4_ = auVar125._24_4_ * auVar106._24_4_;
      auVar102._28_4_ = 0;
      auVar96 = vfmsub231ps_fma(auVar102,auVar228,auVar104);
      auVar33._4_4_ = auVar98._4_4_ * auVar104._4_4_;
      auVar33._0_4_ = auVar98._0_4_ * auVar104._0_4_;
      auVar33._8_4_ = auVar98._8_4_ * auVar104._8_4_;
      auVar33._12_4_ = auVar98._12_4_ * auVar104._12_4_;
      auVar33._16_4_ = auVar98._16_4_ * auVar104._16_4_;
      auVar33._20_4_ = auVar98._20_4_ * auVar104._20_4_;
      auVar33._24_4_ = auVar98._24_4_ * auVar104._24_4_;
      auVar33._28_4_ = auVar104._28_4_;
      auVar121 = vfmsub231ps_fma(auVar33,auVar154,auVar125);
      auVar34._4_4_ = auVar228._4_4_ * auVar154._4_4_;
      auVar34._0_4_ = auVar228._0_4_ * auVar154._0_4_;
      auVar34._8_4_ = auVar228._8_4_ * auVar154._8_4_;
      auVar34._12_4_ = auVar228._12_4_ * auVar154._12_4_;
      auVar34._16_4_ = auVar228._16_4_ * auVar154._16_4_;
      auVar34._20_4_ = auVar228._20_4_ * auVar154._20_4_;
      auVar34._24_4_ = auVar228._24_4_ * auVar154._24_4_;
      auVar34._28_4_ = auVar105._28_4_;
      auVar142 = vfmsub231ps_fma(auVar34,auVar98,auVar106);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar142),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar121));
      auVar106 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar121));
      auVar106 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,2);
      auVar96 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
      auVar168 = vpand_avx(auVar96,auVar168);
      auVar106 = vpmovsxwd_avx2(auVar168);
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
LAB_0112630e:
        auVar174._8_8_ = local_540[1]._8_8_;
        auVar174._0_8_ = local_540[1]._0_8_;
        auVar174._16_8_ = local_540[1]._16_8_;
        auVar174._24_8_ = local_540[1]._24_8_;
        auVar204 = ZEXT3264(CONCAT428(fStack_63c,
                                      CONCAT424(local_640,
                                                CONCAT420(fStack_63c,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(fStack_63c,
                                                                              CONCAT48(local_640,
                                                                                       uVar92)))))))
        ;
      }
      else {
        auVar35._4_4_ = auVar153._4_4_ * auVar125._4_4_;
        auVar35._0_4_ = auVar153._0_4_ * auVar125._0_4_;
        auVar35._8_4_ = auVar153._8_4_ * auVar125._8_4_;
        auVar35._12_4_ = auVar153._12_4_ * auVar125._12_4_;
        auVar35._16_4_ = auVar153._16_4_ * auVar125._16_4_;
        auVar35._20_4_ = auVar153._20_4_ * auVar125._20_4_;
        auVar35._24_4_ = auVar153._24_4_ * auVar125._24_4_;
        auVar35._28_4_ = auVar106._28_4_;
        auVar122 = vfmsub231ps_fma(auVar35,auVar98,auVar186);
        auVar128._0_4_ = auVar186._0_4_ * auVar228._0_4_;
        auVar128._4_4_ = auVar186._4_4_ * auVar228._4_4_;
        auVar128._8_4_ = auVar186._8_4_ * auVar228._8_4_;
        auVar128._12_4_ = auVar186._12_4_ * auVar228._12_4_;
        auVar128._16_4_ = auVar186._16_4_ * auVar228._16_4_;
        auVar128._20_4_ = auVar186._20_4_ * auVar228._20_4_;
        auVar128._24_4_ = auVar186._24_4_ * auVar228._24_4_;
        auVar128._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar128,auVar134,auVar125);
        auVar36._4_4_ = auVar134._4_4_ * auVar98._4_4_;
        auVar36._0_4_ = auVar134._0_4_ * auVar98._0_4_;
        auVar36._8_4_ = auVar134._8_4_ * auVar98._8_4_;
        auVar36._12_4_ = auVar134._12_4_ * auVar98._12_4_;
        auVar36._16_4_ = auVar134._16_4_ * auVar98._16_4_;
        auVar36._20_4_ = auVar134._20_4_ * auVar98._20_4_;
        auVar36._24_4_ = auVar134._24_4_ * auVar98._24_4_;
        auVar36._28_4_ = auVar154._28_4_;
        auVar157 = vfmsub231ps_fma(auVar36,auVar228,auVar153);
        auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar157));
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar122),_DAT_01f7b000);
        auVar106 = vrcpps_avx(ZEXT1632(auVar142));
        auVar219._8_4_ = 0x3f800000;
        auVar219._0_8_ = 0x3f8000003f800000;
        auVar219._12_4_ = 0x3f800000;
        auVar219._16_4_ = 0x3f800000;
        auVar219._20_4_ = 0x3f800000;
        auVar219._24_4_ = 0x3f800000;
        auVar219._28_4_ = 0x3f800000;
        auVar96 = vfnmadd213ps_fma(auVar106,ZEXT1632(auVar142),auVar219);
        auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar106,auVar106);
        auVar185._0_4_ = auVar157._0_4_ * auVar8._0_4_;
        auVar185._4_4_ = auVar157._4_4_ * auVar8._4_4_;
        auVar185._8_4_ = auVar157._8_4_ * auVar8._8_4_;
        auVar185._12_4_ = auVar157._12_4_ * auVar8._12_4_;
        auVar185._16_4_ = auVar8._16_4_ * 0.0;
        auVar185._20_4_ = auVar8._20_4_ * 0.0;
        auVar185._24_4_ = auVar8._24_4_ * 0.0;
        auVar185._28_4_ = 0;
        auVar94 = vfmadd231ps_fma(auVar185,auVar109,ZEXT1632(auVar94));
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar122),auVar100);
        fVar140 = auVar96._0_4_;
        fVar111 = auVar96._4_4_;
        fVar113 = auVar96._8_4_;
        fVar115 = auVar96._12_4_;
        auVar154 = ZEXT1632(CONCAT412(fVar115 * auVar94._12_4_,
                                      CONCAT48(fVar113 * auVar94._8_4_,
                                               CONCAT44(fVar111 * auVar94._4_4_,
                                                        fVar140 * auVar94._0_4_))));
        auVar188 = ZEXT3264(auVar154);
        auVar103._4_4_ = uVar5;
        auVar103._0_4_ = uVar5;
        auVar103._8_4_ = uVar5;
        auVar103._12_4_ = uVar5;
        auVar103._16_4_ = uVar5;
        auVar103._20_4_ = uVar5;
        auVar103._24_4_ = uVar5;
        auVar103._28_4_ = uVar5;
        uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar129._4_4_ = uVar90;
        auVar129._0_4_ = uVar90;
        auVar129._8_4_ = uVar90;
        auVar129._12_4_ = uVar90;
        auVar129._16_4_ = uVar90;
        auVar129._20_4_ = uVar90;
        auVar129._24_4_ = uVar90;
        auVar129._28_4_ = uVar90;
        auVar109 = vcmpps_avx(auVar103,auVar154,2);
        auVar106 = vcmpps_avx(auVar154,auVar129,2);
        auVar109 = vandps_avx(auVar106,auVar109);
        auVar96 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
        auVar168 = vpand_avx(auVar168,auVar96);
        auVar109 = vpmovsxwd_avx2(auVar168);
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar109 >> 0x7f,0) == '\0') &&
              (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar109 >> 0xbf,0) == '\0') &&
            (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar109[0x1f]) goto LAB_0112630e;
        auVar109 = vcmpps_avx(ZEXT1632(auVar142),ZEXT832(0) << 0x20,4);
        auVar96 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
        auVar168 = vpand_avx(auVar168,auVar96);
        auVar109 = vpmovsxwd_avx2(auVar168);
        auVar174._8_8_ = local_540[1]._8_8_;
        auVar174._0_8_ = local_540[1]._0_8_;
        auVar174._16_8_ = local_540[1]._16_8_;
        auVar174._24_8_ = local_540[1]._24_8_;
        auVar204 = ZEXT3264(CONCAT428(fStack_63c,
                                      CONCAT424(local_640,
                                                CONCAT420(fStack_63c,
                                                          CONCAT416(local_640,
                                                                    CONCAT412(fStack_63c,
                                                                              CONCAT48(local_640,
                                                                                       uVar92)))))))
        ;
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          auVar104 = ZEXT1632(CONCAT412(fVar115 * auVar95._12_4_,
                                        CONCAT48(fVar113 * auVar95._8_4_,
                                                 CONCAT44(fVar111 * auVar95._4_4_,
                                                          fVar140 * auVar95._0_4_))));
          auVar130 = ZEXT1632(CONCAT412(fVar115 * auVar121._12_4_,
                                        CONCAT48(fVar113 * auVar121._8_4_,
                                                 CONCAT44(fVar111 * auVar121._4_4_,
                                                          fVar140 * auVar121._0_4_))));
          auVar173._8_4_ = 0x3f800000;
          auVar173._0_8_ = 0x3f8000003f800000;
          auVar173._12_4_ = 0x3f800000;
          auVar173._16_4_ = 0x3f800000;
          auVar173._20_4_ = 0x3f800000;
          auVar173._24_4_ = 0x3f800000;
          auVar173._28_4_ = 0x3f800000;
          auVar106 = vsubps_avx(auVar173,auVar104);
          _local_120 = vblendvps_avx(auVar106,auVar104,auVar99);
          auVar106 = vsubps_avx(auVar173,auVar130);
          local_340 = vblendvps_avx(auVar106,auVar130,auVar99);
          auVar174 = auVar109;
          local_4e0 = auVar154;
        }
      }
      auVar235 = ZEXT3264(local_7a0);
      auVar229 = ZEXT3264(local_6c0);
      auVar226 = ZEXT3264(_local_6e0);
      auVar160 = ZEXT3264(auVar222);
      auVar139 = ZEXT3264(auVar217);
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar174 >> 0x7f,0) == '\0') &&
            (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar174 >> 0xbf,0) == '\0') &&
          (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar174[0x1f]) {
        auVar139 = ZEXT3264(local_660);
        auVar160 = ZEXT3264(local_560);
        auVar156 = ZEXT3264(local_5e0);
        auVar197 = ZEXT3264(local_720);
      }
      else {
        auVar109 = vsubps_avx(auVar193,auVar126);
        auVar168 = vfmadd213ps_fma(auVar109,_local_120,auVar126);
        fVar140 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar37._4_4_ = (auVar168._4_4_ + auVar168._4_4_) * fVar140;
        auVar37._0_4_ = (auVar168._0_4_ + auVar168._0_4_) * fVar140;
        auVar37._8_4_ = (auVar168._8_4_ + auVar168._8_4_) * fVar140;
        auVar37._12_4_ = (auVar168._12_4_ + auVar168._12_4_) * fVar140;
        auVar37._16_4_ = fVar140 * 0.0;
        auVar37._20_4_ = fVar140 * 0.0;
        auVar37._24_4_ = fVar140 * 0.0;
        auVar37._28_4_ = 0;
        auVar188 = ZEXT3264(local_4e0);
        auVar109 = vcmpps_avx(local_4e0,auVar37,6);
        auVar106 = auVar174 & auVar109;
        auVar156 = ZEXT3264(local_5e0);
        auVar197 = ZEXT3264(local_720);
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar139 = ZEXT3264(local_660);
          auVar160 = ZEXT3264(local_560);
        }
        else {
          auVar131._8_4_ = 0xbf800000;
          auVar131._0_8_ = 0xbf800000bf800000;
          auVar131._12_4_ = 0xbf800000;
          auVar131._16_4_ = 0xbf800000;
          auVar131._20_4_ = 0xbf800000;
          auVar131._24_4_ = 0xbf800000;
          auVar131._28_4_ = 0xbf800000;
          auVar152._8_4_ = 0x40000000;
          auVar152._0_8_ = 0x4000000040000000;
          auVar152._12_4_ = 0x40000000;
          auVar152._16_4_ = 0x40000000;
          auVar152._20_4_ = 0x40000000;
          auVar152._24_4_ = 0x40000000;
          auVar152._28_4_ = 0x40000000;
          auVar168 = vfmadd213ps_fma(local_340,auVar152,auVar131);
          local_260 = _local_120;
          local_340 = ZEXT1632(auVar168);
          auVar106 = local_340;
          local_240 = ZEXT1632(auVar168);
          local_220 = local_4e0;
          local_200 = 0;
          local_1fc = iVar11;
          local_1f0 = uVar78;
          uStack_1e8 = uVar79;
          local_1e0 = local_7c0;
          uStack_1d8 = uStack_7b8;
          local_1d0 = local_7d0;
          uStack_1c8 = uStack_7c8;
          local_1c0 = local_7e0;
          uStack_1b8 = uStack_7d8;
          local_340 = auVar106;
          if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_540[0] = vandps_avx(auVar109,auVar174);
            fVar140 = 1.0 / (float)local_460._0_4_;
            local_180[0] = fVar140 * ((float)local_120._0_4_ + 0.0);
            local_180[1] = fVar140 * ((float)local_120._4_4_ + 1.0);
            local_180[2] = fVar140 * (fStack_118 + 2.0);
            local_180[3] = fVar140 * (fStack_114 + 3.0);
            fStack_170 = fVar140 * (fStack_110 + 4.0);
            fStack_16c = fVar140 * (fStack_10c + 5.0);
            fStack_168 = fVar140 * (fStack_108 + 6.0);
            fStack_164 = fStack_104 + 7.0;
            local_340._0_8_ = auVar168._0_8_;
            local_340._8_8_ = auVar168._8_8_;
            local_160 = local_340._0_8_;
            uStack_158 = local_340._8_8_;
            uStack_150 = 0;
            uStack_148 = 0;
            local_140 = local_4e0;
            auVar132._8_4_ = 0x7f800000;
            auVar132._0_8_ = 0x7f8000007f800000;
            auVar132._12_4_ = 0x7f800000;
            auVar132._16_4_ = 0x7f800000;
            auVar132._20_4_ = 0x7f800000;
            auVar132._24_4_ = 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar109 = vblendvps_avx(auVar132,local_4e0,local_540[0]);
            auVar106 = vshufps_avx(auVar109,auVar109,0xb1);
            auVar106 = vminps_avx(auVar109,auVar106);
            auVar154 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar154);
            auVar154 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar154);
            auVar106 = vcmpps_avx(auVar109,auVar106,0);
            auVar154 = local_540[0] & auVar106;
            auVar109 = local_540[0];
            if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar154 >> 0x7f,0) != '\0') ||
                  (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar154 >> 0xbf,0) != '\0') ||
                (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar154[0x1f] < '\0') {
              auVar109 = vandps_avx(auVar106,local_540[0]);
            }
            uVar84 = vmovmskps_avx(auVar109);
            uVar5 = 0;
            for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              uVar5 = uVar5 + 1;
            }
            uVar85 = (ulong)uVar5;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar140 = local_180[uVar85];
              uVar90 = *(undefined4 *)((long)&local_160 + uVar85 * 4);
              fVar111 = 1.0 - fVar140;
              auVar165 = ZEXT416((uint)(fVar140 * fVar111 * 4.0));
              auVar168 = vfnmsub213ss_fma(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),auVar165);
              auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar111),ZEXT416((uint)fVar111),auVar165);
              auVar188 = ZEXT464(0x3f000000);
              fVar111 = fVar111 * -fVar111 * 0.5;
              fVar113 = auVar168._0_4_ * 0.5;
              fVar115 = auVar165._0_4_ * 0.5;
              fVar116 = fVar140 * fVar140 * 0.5;
              auVar163._0_4_ = fVar116 * fVar110;
              auVar163._4_4_ = fVar116 * fVar112;
              auVar163._8_4_ = fVar116 * fVar114;
              auVar163._12_4_ = fVar116 * fVar68;
              auVar143._4_4_ = fVar115;
              auVar143._0_4_ = fVar115;
              auVar143._8_4_ = fVar115;
              auVar143._12_4_ = fVar115;
              auVar165 = vfmadd132ps_fma(auVar143,auVar163,auVar18);
              auVar164._4_4_ = fVar113;
              auVar164._0_4_ = fVar113;
              auVar164._8_4_ = fVar113;
              auVar164._12_4_ = fVar113;
              auVar165 = vfmadd132ps_fma(auVar164,auVar165,auVar17);
              auVar144._4_4_ = fVar111;
              auVar144._0_4_ = fVar111;
              auVar144._8_4_ = fVar111;
              auVar144._12_4_ = fVar111;
              auVar165 = vfmadd132ps_fma(auVar144,auVar165,*(undefined1 (*) [16])pPVar1);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar85 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
              uVar220 = vextractps_avx(auVar165,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar220;
              uVar220 = vextractps_avx(auVar165,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar220;
              *(float *)(ray + k * 4 + 0xf0) = fVar140;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar90;
              *(uint *)(ray + k * 4 + 0x110) = uVar83;
              *(uint *)(ray + k * 4 + 0x120) = uVar10;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_700._4_4_ = uVar10;
              local_700._0_4_ = uVar10;
              local_700._8_4_ = uVar10;
              local_700._16_16_ = auVar8._16_16_;
              local_700._12_4_ = uVar10;
              local_580._0_8_ = CONCAT44(uVar83,uVar83);
              local_580 = ZEXT1632(CONCAT412(uVar83,CONCAT48(uVar83,local_580._0_8_)));
              local_5a0 = ZEXT1632(*local_688);
              auStack_7f0 = auVar100._16_16_;
              local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              local_780 = auVar222;
              local_620 = auVar217;
              while( true ) {
                auVar100 = _local_800;
                fVar140 = local_180[uVar85];
                local_3e0._4_4_ = fVar140;
                local_3e0._0_4_ = fVar140;
                local_3e0._8_4_ = fVar140;
                local_3e0._12_4_ = fVar140;
                local_3d0 = *(undefined4 *)((long)&local_160 + uVar85 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar85 * 4);
                fVar113 = 1.0 - fVar140;
                auVar168 = ZEXT416((uint)(fVar140 * fVar113 * 4.0));
                auVar96 = vfnmsub213ss_fma(local_3e0,local_3e0,auVar168);
                auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),auVar168);
                auVar188 = ZEXT464(0x3f000000);
                fVar111 = auVar168._0_4_ * 0.5;
                fVar140 = fVar140 * fVar140 * 0.5;
                auVar171._0_4_ = fVar140 * fVar110;
                auVar171._4_4_ = fVar140 * fVar112;
                auVar171._8_4_ = fVar140 * fVar114;
                auVar171._12_4_ = fVar140 * fVar68;
                auVar149._4_4_ = fVar111;
                auVar149._0_4_ = fVar111;
                auVar149._8_4_ = fVar111;
                auVar149._12_4_ = fVar111;
                auVar168 = vfmadd132ps_fma(auVar149,auVar171,auVar18);
                fVar140 = auVar96._0_4_ * 0.5;
                auVar172._4_4_ = fVar140;
                auVar172._0_4_ = fVar140;
                auVar172._8_4_ = fVar140;
                auVar172._12_4_ = fVar140;
                auVar168 = vfmadd132ps_fma(auVar172,auVar168,auVar17);
                local_750.context = context->user;
                fVar140 = fVar113 * -fVar113 * 0.5;
                auVar150._4_4_ = fVar140;
                auVar150._0_4_ = fVar140;
                auVar150._8_4_ = fVar140;
                auVar150._12_4_ = fVar140;
                auVar96 = vfmadd132ps_fma(auVar150,auVar168,auVar165);
                local_410 = auVar96._0_4_;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                auVar168 = vshufps_avx(auVar96,auVar96,0x55);
                local_400 = auVar168;
                local_3f0 = vshufps_avx(auVar96,auVar96,0xaa);
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                local_3c0 = local_580._0_8_;
                uStack_3b8 = local_580._8_8_;
                local_3b0 = local_700._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_700._0_16_),ZEXT1632(local_700._0_16_));
                uStack_39c = (local_750.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_750.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_7b0 = local_5a0._0_16_;
                local_750.valid = (int *)local_7b0;
                local_750.geometryUserPtr = *(void **)(CONCAT44(uStack_4fc,local_500) + 0x18);
                local_750.hit = (RTCHitN *)&local_410;
                local_750.N = 4;
                pcVar14 = *(code **)(CONCAT44(uStack_4fc,local_500) + 0x40);
                local_750.ray = (RTCRayN *)ray;
                if (pcVar14 != (code *)0x0) {
                  auVar188 = ZEXT1664(auVar188._0_16_);
                  (*pcVar14)(&local_750);
                  auVar226 = ZEXT3264(_local_6e0);
                  auVar139 = ZEXT3264(local_620);
                  auVar229 = ZEXT3264(local_6c0);
                  auVar160 = ZEXT3264(local_780);
                  auVar235 = ZEXT3264(local_7a0);
                  auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar197 = ZEXT3264(local_720);
                }
                if (local_7b0 == (undefined1  [16])0x0) {
                  auVar168 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                  auVar168 = auVar168 ^ auVar96;
                }
                else {
                  p_Var13 = context->args->filter;
                  auVar96 = vpcmpeqd_avx(auVar168,auVar168);
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_4fc,local_500) + 0x3e) & 0x40) != 0)))) {
                    auVar188 = ZEXT1664(auVar188._0_16_);
                    (*p_Var13)(&local_750);
                    auVar226 = ZEXT3264(_local_6e0);
                    auVar139 = ZEXT3264(local_620);
                    auVar229 = ZEXT3264(local_6c0);
                    auVar160 = ZEXT3264(local_780);
                    auVar235 = ZEXT3264(local_7a0);
                    auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                                  CONCAT424(fStack_628,
                                                            CONCAT420(fStack_62c,
                                                                      CONCAT416(fStack_630,
                                                                                CONCAT412(fStack_634
                                                                                          ,CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                    auVar197 = ZEXT3264(local_720);
                    auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                  }
                  auVar95 = vpcmpeqd_avx(local_7b0,_DAT_01f45a50);
                  auVar168 = auVar95 ^ auVar96;
                  if (local_7b0 != (undefined1  [16])0x0) {
                    auVar95 = auVar95 ^ auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])local_750.hit);
                    *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x10));
                    *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x20));
                    *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x30));
                    *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x40));
                    *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x50));
                    *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x60));
                    *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x70));
                    *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar96;
                    auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])(local_750.hit + 0x80));
                    *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar96;
                  }
                }
                auVar109 = local_4e0;
                auVar222 = auVar160._0_32_;
                auVar217 = auVar139._0_32_;
                auVar124._8_8_ = 0x100000001;
                auVar124._0_8_ = 0x100000001;
                if ((auVar124 & auVar168) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_800._0_4_;
                }
                else {
                  local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_800._4_4_ = 0;
                  local_800._8_4_ = 0;
                  local_800._12_4_ = 0;
                }
                *(undefined4 *)(local_540[0] + uVar85 * 4) = 0;
                auStack_7f0 = auVar100._16_16_;
                auVar108._4_4_ = local_800._0_4_;
                auVar108._0_4_ = local_800._0_4_;
                auVar108._8_4_ = local_800._0_4_;
                auVar108._12_4_ = local_800._0_4_;
                auVar108._16_4_ = local_800._0_4_;
                auVar108._20_4_ = local_800._0_4_;
                auVar108._24_4_ = local_800._0_4_;
                auVar108._28_4_ = local_800._0_4_;
                auVar8 = vcmpps_avx(auVar109,auVar108,2);
                auVar100 = vandps_avx(auVar8,local_540[0]);
                local_540[0] = local_540[0] & auVar8;
                if ((((((((local_540[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_540[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_540[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_540[0] >> 0x7f,0) == '\0') &&
                      (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_540[0] >> 0xbf,0) == '\0') &&
                    (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_540[0][0x1f]) break;
                auVar138._8_4_ = 0x7f800000;
                auVar138._0_8_ = 0x7f8000007f800000;
                auVar138._12_4_ = 0x7f800000;
                auVar138._16_4_ = 0x7f800000;
                auVar138._20_4_ = 0x7f800000;
                auVar138._24_4_ = 0x7f800000;
                auVar138._28_4_ = 0x7f800000;
                auVar109 = vblendvps_avx(auVar138,auVar109,auVar100);
                auVar8 = vshufps_avx(auVar109,auVar109,0xb1);
                auVar8 = vminps_avx(auVar109,auVar8);
                auVar106 = vshufpd_avx(auVar8,auVar8,5);
                auVar8 = vminps_avx(auVar8,auVar106);
                auVar106 = vpermpd_avx2(auVar8,0x4e);
                auVar8 = vminps_avx(auVar8,auVar106);
                auVar8 = vcmpps_avx(auVar109,auVar8,0);
                auVar106 = auVar100 & auVar8;
                auVar109 = auVar100;
                if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar106 >> 0x7f,0) != '\0') ||
                      (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar106 >> 0xbf,0) != '\0') ||
                    (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar106[0x1f] < '\0') {
                  auVar109 = vandps_avx(auVar8,auVar100);
                }
                uVar84 = vmovmskps_avx(auVar109);
                uVar5 = 0;
                for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                  uVar5 = uVar5 + 1;
                }
                uVar85 = (ulong)uVar5;
                local_540[0] = auVar100;
              }
            }
          }
          auVar139 = ZEXT3264(local_660);
          auVar160 = ZEXT3264(local_560);
          auVar156 = ZEXT3264(local_5e0);
        }
      }
    }
    local_700._0_8_ = pPVar88;
    if (8 < iVar11) {
      local_300._4_4_ = iVar11;
      local_300._0_4_ = iVar11;
      local_300._8_4_ = iVar11;
      local_300._12_4_ = iVar11;
      local_300._16_4_ = iVar11;
      local_300._20_4_ = iVar11;
      local_300._24_4_ = iVar11;
      local_300._28_4_ = iVar11;
      local_320._4_4_ = fVar141;
      local_320._0_4_ = fVar141;
      fStack_318 = fVar141;
      fStack_314 = fVar141;
      fStack_310 = fVar141;
      fStack_30c = fVar141;
      fStack_308 = fVar141;
      fStack_304 = fVar141;
      local_500 = local_680._0_4_;
      uStack_4fc = local_680._0_4_;
      uStack_4f8 = local_680._0_4_;
      uStack_4f4 = local_680._0_4_;
      uStack_4f0 = local_680._0_4_;
      uStack_4ec = local_680._0_4_;
      uStack_4e8 = local_680._0_4_;
      uStack_4e4 = local_680._0_4_;
      local_100 = 1.0 / (float)local_460._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      local_290 = local_4c0._0_4_;
      uStack_28c = local_4c0._0_4_;
      uStack_288 = local_4c0._0_4_;
      uStack_284 = local_4c0._0_4_;
      local_2a0 = local_480._0_4_;
      uStack_29c = local_480._0_4_;
      uStack_298 = local_480._0_4_;
      uStack_294 = local_480._0_4_;
      local_6c0 = auVar229._0_32_;
      _local_6e0 = auVar226._0_32_;
      local_780 = auVar222;
      local_620 = auVar217;
      for (lVar89 = 8; local_660 = auVar139._0_32_, lVar89 < iVar11; lVar89 = lVar89 + 8) {
        auVar100 = *(undefined1 (*) [32])(bspline_basis0 + lVar89 * 4 + lVar87);
        auVar109 = *(undefined1 (*) [32])(lVar87 + 0x21fffac + lVar89 * 4);
        auVar8 = *(undefined1 (*) [32])(lVar87 + 0x2200430 + lVar89 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar87 + 0x22008b4 + lVar89 * 4);
        fVar118 = *(float *)*pauVar2;
        fVar207 = *(float *)(*pauVar2 + 4);
        fVar209 = *(float *)(*pauVar2 + 8);
        fVar211 = *(float *)(*pauVar2 + 0xc);
        fVar213 = *(float *)(*pauVar2 + 0x10);
        fVar69 = *(float *)(*pauVar2 + 0x14);
        fVar70 = *(float *)(*pauVar2 + 0x18);
        auVar81 = *(undefined1 (*) [28])*pauVar2;
        auVar227._0_4_ = fVar118 * local_600;
        auVar227._4_4_ = fVar207 * fStack_5fc;
        auVar227._8_4_ = fVar209 * fStack_5f8;
        auVar227._12_4_ = fVar211 * fStack_5f4;
        auVar227._16_4_ = fVar213 * fStack_5f0;
        auVar227._20_4_ = fVar69 * fStack_5ec;
        auVar227._28_36_ = auVar226._28_36_;
        auVar227._24_4_ = fVar70 * fStack_5e8;
        fVar198 = auVar204._0_4_;
        auVar226._0_4_ = fVar198 * fVar118;
        fVar205 = auVar204._4_4_;
        auVar226._4_4_ = fVar205 * fVar207;
        fVar206 = auVar204._8_4_;
        auVar226._8_4_ = fVar206 * fVar209;
        fVar208 = auVar204._12_4_;
        auVar226._12_4_ = fVar208 * fVar211;
        fVar210 = auVar204._16_4_;
        auVar226._16_4_ = fVar210 * fVar213;
        fVar212 = auVar204._20_4_;
        auVar226._20_4_ = fVar212 * fVar69;
        auVar226._28_36_ = auVar139._28_36_;
        fVar214 = auVar204._24_4_;
        auVar226._24_4_ = fVar214 * fVar70;
        auVar165 = vfmadd231ps_fma(auVar227._0_32_,auVar8,auVar160._0_32_);
        auVar168 = vfmadd231ps_fma(auVar226._0_32_,auVar8,auVar197._0_32_);
        auVar153 = auVar156._0_32_;
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar109,auVar153);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar109,local_4a0);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar100,auVar235._0_32_);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar100,local_440);
        auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar89 * 4 + lVar87);
        auVar154 = *(undefined1 (*) [32])(lVar87 + 0x22023cc + lVar89 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar87 + 0x2202850 + lVar89 * 4);
        pfVar3 = (float *)(lVar87 + 0x2202cd4 + lVar89 * 4);
        fVar71 = *pfVar3;
        fVar72 = pfVar3[1];
        fVar73 = pfVar3[2];
        fVar74 = pfVar3[3];
        fVar75 = pfVar3[4];
        fVar76 = pfVar3[5];
        fVar77 = pfVar3[6];
        auVar230._0_4_ = local_600 * fVar71;
        auVar230._4_4_ = fStack_5fc * fVar72;
        auVar230._8_4_ = fStack_5f8 * fVar73;
        auVar230._12_4_ = fStack_5f4 * fVar74;
        auVar230._16_4_ = fStack_5f0 * fVar75;
        auVar230._20_4_ = fStack_5ec * fVar76;
        auVar230._28_36_ = auVar229._28_36_;
        auVar230._24_4_ = fStack_5e8 * fVar77;
        auVar229._0_4_ = fVar198 * fVar71;
        auVar229._4_4_ = fVar205 * fVar72;
        auVar229._8_4_ = fVar206 * fVar73;
        auVar229._12_4_ = fVar208 * fVar74;
        auVar229._16_4_ = fVar210 * fVar75;
        auVar229._20_4_ = fVar212 * fVar76;
        auVar229._28_36_ = auVar188._28_36_;
        auVar229._24_4_ = fVar214 * fVar77;
        auVar96 = vfmadd231ps_fma(auVar230._0_32_,auVar104,auVar160._0_32_);
        auVar95 = vfmadd231ps_fma(auVar229._0_32_,auVar104,auVar197._0_32_);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar154,auVar153);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar154,local_4a0);
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar106,auVar235._0_32_);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,local_440);
        local_580 = ZEXT1632(auVar96);
        local_5a0 = ZEXT1632(auVar165);
        local_460 = vsubps_avx(local_580,local_5a0);
        auVar186 = ZEXT1632(auVar95);
        local_680 = ZEXT1632(auVar168);
        local_2c0 = vsubps_avx(auVar186,local_680);
        auVar38._4_4_ = auVar168._4_4_ * local_460._4_4_;
        auVar38._0_4_ = auVar168._0_4_ * local_460._0_4_;
        auVar38._8_4_ = auVar168._8_4_ * local_460._8_4_;
        auVar38._12_4_ = auVar168._12_4_ * local_460._12_4_;
        auVar38._16_4_ = local_460._16_4_ * 0.0;
        auVar38._20_4_ = local_460._20_4_ * 0.0;
        auVar38._24_4_ = local_460._24_4_ * 0.0;
        auVar38._28_4_ = local_440._28_4_;
        fVar141 = local_2c0._0_4_;
        auVar133._0_4_ = auVar165._0_4_ * fVar141;
        fVar140 = local_2c0._4_4_;
        auVar133._4_4_ = auVar165._4_4_ * fVar140;
        fVar111 = local_2c0._8_4_;
        auVar133._8_4_ = auVar165._8_4_ * fVar111;
        fVar113 = local_2c0._12_4_;
        auVar133._12_4_ = auVar165._12_4_ * fVar113;
        fVar115 = local_2c0._16_4_;
        auVar133._16_4_ = fVar115 * 0.0;
        fVar116 = local_2c0._20_4_;
        auVar133._20_4_ = fVar116 * 0.0;
        fVar117 = local_2c0._24_4_;
        auVar133._24_4_ = fVar117 * 0.0;
        auVar133._28_4_ = 0;
        auVar226 = ZEXT3264(auVar8);
        auVar105 = vsubps_avx(auVar38,auVar133);
        _local_2e0 = *pauVar2;
        auVar99 = _local_2e0;
        auVar39._4_4_ = local_e0._4_4_ * fVar207;
        auVar39._0_4_ = (float)local_e0 * fVar118;
        auVar39._8_4_ = (float)uStack_d8 * fVar209;
        auVar39._12_4_ = uStack_d8._4_4_ * fVar211;
        auVar39._16_4_ = (float)uStack_d0 * fVar213;
        auVar39._20_4_ = uStack_d0._4_4_ * fVar69;
        auVar39._24_4_ = (float)uStack_c8 * fVar70;
        auVar39._28_4_ = 0;
        auVar165 = vfmadd231ps_fma(auVar39,auVar8,local_c0);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_a0,auVar109);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_80,auVar100);
        auVar40._4_4_ = local_e0._4_4_ * fVar72;
        auVar40._0_4_ = (float)local_e0 * fVar71;
        auVar40._8_4_ = (float)uStack_d8 * fVar73;
        auVar40._12_4_ = uStack_d8._4_4_ * fVar74;
        auVar40._16_4_ = (float)uStack_d0 * fVar75;
        auVar40._20_4_ = uStack_d0._4_4_ * fVar76;
        auVar40._24_4_ = (float)uStack_c8 * fVar77;
        auVar40._28_4_ = uStack_c8._4_4_;
        auVar168 = vfmadd231ps_fma(auVar40,auVar104,local_c0);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar154,local_a0);
        auVar188 = ZEXT3264(auVar106);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar106,local_80);
        auVar229 = ZEXT1664(auVar168);
        auVar139._0_4_ = fVar141 * fVar141;
        auVar139._4_4_ = fVar140 * fVar140;
        auVar139._8_4_ = fVar111 * fVar111;
        auVar139._12_4_ = fVar113 * fVar113;
        auVar139._16_4_ = fVar115 * fVar115;
        auVar139._20_4_ = fVar116 * fVar116;
        auVar139._28_36_ = auVar204._28_36_;
        auVar139._24_4_ = fVar117 * fVar117;
        auVar96 = vfmadd231ps_fma(auVar139._0_32_,local_460,local_460);
        auVar134 = ZEXT1632(auVar165);
        auVar228 = ZEXT1632(auVar168);
        auVar130 = vmaxps_avx(auVar134,auVar228);
        auVar201._0_4_ = auVar130._0_4_ * auVar130._0_4_ * auVar96._0_4_;
        auVar201._4_4_ = auVar130._4_4_ * auVar130._4_4_ * auVar96._4_4_;
        auVar201._8_4_ = auVar130._8_4_ * auVar130._8_4_ * auVar96._8_4_;
        auVar201._12_4_ = auVar130._12_4_ * auVar130._12_4_ * auVar96._12_4_;
        auVar201._16_4_ = auVar130._16_4_ * auVar130._16_4_ * 0.0;
        auVar201._20_4_ = auVar130._20_4_ * auVar130._20_4_ * 0.0;
        auVar201._24_4_ = auVar130._24_4_ * auVar130._24_4_ * 0.0;
        auVar201._28_4_ = 0;
        auVar41._4_4_ = auVar105._4_4_ * auVar105._4_4_;
        auVar41._0_4_ = auVar105._0_4_ * auVar105._0_4_;
        auVar41._8_4_ = auVar105._8_4_ * auVar105._8_4_;
        auVar41._12_4_ = auVar105._12_4_ * auVar105._12_4_;
        auVar41._16_4_ = auVar105._16_4_ * auVar105._16_4_;
        auVar41._20_4_ = auVar105._20_4_ * auVar105._20_4_;
        auVar41._24_4_ = auVar105._24_4_ * auVar105._24_4_;
        auVar41._28_4_ = auVar105._28_4_;
        auVar130 = vcmpps_avx(auVar41,auVar201,2);
        local_200 = (int)lVar89;
        auVar202._4_4_ = local_200;
        auVar202._0_4_ = local_200;
        auVar202._8_4_ = local_200;
        auVar202._12_4_ = local_200;
        auVar202._16_4_ = local_200;
        auVar202._20_4_ = local_200;
        auVar202._24_4_ = local_200;
        auVar202._28_4_ = local_200;
        auVar105 = vpor_avx2(auVar202,_DAT_01fb4ba0);
        auVar19 = vpcmpgtd_avx2(local_300,auVar105);
        auVar105 = auVar19 & auVar130;
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0x7f,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0xbf,0) == '\0') &&
            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar105[0x1f]) {
          auVar139 = ZEXT3264(local_660);
          auVar197 = ZEXT3264(local_720);
          auVar204 = ZEXT3264(auVar204._0_32_);
          auVar156 = ZEXT3264(auVar153);
          auVar235 = ZEXT3264(local_7a0);
        }
        else {
          local_480 = vandps_avx(auVar19,auVar130);
          auVar42._4_4_ = (float)local_6e0._4_4_ * fVar72;
          auVar42._0_4_ = (float)local_6e0._0_4_ * fVar71;
          auVar42._8_4_ = fStack_6d8 * fVar73;
          auVar42._12_4_ = fStack_6d4 * fVar74;
          auVar42._16_4_ = fStack_6d0 * fVar75;
          auVar42._20_4_ = fStack_6cc * fVar76;
          auVar42._24_4_ = fStack_6c8 * fVar77;
          auVar42._28_4_ = auVar130._28_4_;
          auVar165 = vfmadd213ps_fma(auVar104,local_620,auVar42);
          auVar165 = vfmadd213ps_fma(auVar154,local_6c0,ZEXT1632(auVar165));
          auVar165 = vfmadd213ps_fma(auVar106,local_780,ZEXT1632(auVar165));
          _local_5c0 = ZEXT1632(auVar165);
          local_2e0._0_4_ = auVar81._0_4_;
          local_2e0._4_4_ = auVar81._4_4_;
          fStack_2d8 = auVar81._8_4_;
          fStack_2d4 = auVar81._12_4_;
          fStack_2d0 = auVar81._16_4_;
          fStack_2cc = auVar81._20_4_;
          fStack_2c8 = auVar81._24_4_;
          auVar43._4_4_ = (float)local_6e0._4_4_ * (float)local_2e0._4_4_;
          auVar43._0_4_ = (float)local_6e0._0_4_ * (float)local_2e0._0_4_;
          auVar43._8_4_ = fStack_6d8 * fStack_2d8;
          auVar43._12_4_ = fStack_6d4 * fStack_2d4;
          auVar43._16_4_ = fStack_6d0 * fStack_2d0;
          auVar43._20_4_ = fStack_6cc * fStack_2cc;
          auVar43._24_4_ = fStack_6c8 * fStack_2c8;
          auVar43._28_4_ = auVar130._28_4_;
          auVar165 = vfmadd213ps_fma(auVar8,local_620,auVar43);
          auVar165 = vfmadd213ps_fma(auVar109,local_6c0,ZEXT1632(auVar165));
          auVar109 = *(undefined1 (*) [32])(lVar87 + 0x2200d38 + lVar89 * 4);
          auVar8 = *(undefined1 (*) [32])(lVar87 + 0x22011bc + lVar89 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar87 + 0x2201640 + lVar89 * 4);
          pfVar4 = (float *)(lVar87 + 0x2201ac4 + lVar89 * 4);
          fVar141 = *pfVar4;
          fVar140 = pfVar4[1];
          fVar111 = pfVar4[2];
          fVar113 = pfVar4[3];
          fVar115 = pfVar4[4];
          fVar116 = pfVar4[5];
          fVar117 = pfVar4[6];
          auVar44._4_4_ = fVar140 * fStack_5fc;
          auVar44._0_4_ = fVar141 * local_600;
          auVar44._8_4_ = fVar111 * fStack_5f8;
          auVar44._12_4_ = fVar113 * fStack_5f4;
          auVar44._16_4_ = fVar115 * fStack_5f0;
          auVar44._20_4_ = fVar116 * fStack_5ec;
          auVar44._24_4_ = fVar117 * fStack_5e8;
          auVar44._28_4_ = pfVar3[7];
          auVar224._0_4_ = fVar141 * fVar198;
          auVar224._4_4_ = fVar140 * fVar205;
          auVar224._8_4_ = fVar111 * fVar206;
          auVar224._12_4_ = fVar113 * fVar208;
          auVar224._16_4_ = fVar115 * fVar210;
          auVar224._20_4_ = fVar116 * fVar212;
          auVar224._24_4_ = fVar117 * fVar214;
          auVar224._28_4_ = 0;
          auVar45._4_4_ = (float)local_6e0._4_4_ * fVar140;
          auVar45._0_4_ = (float)local_6e0._0_4_ * fVar141;
          auVar45._8_4_ = fStack_6d8 * fVar111;
          auVar45._12_4_ = fStack_6d4 * fVar113;
          auVar45._16_4_ = fStack_6d0 * fVar115;
          auVar45._20_4_ = fStack_6cc * fVar116;
          auVar45._24_4_ = fStack_6c8 * fVar117;
          auVar45._28_4_ = pfVar4[7];
          auVar96 = vfmadd231ps_fma(auVar44,auVar106,local_560);
          auVar95 = vfmadd231ps_fma(auVar224,auVar106,local_720);
          auVar121 = vfmadd231ps_fma(auVar45,local_620,auVar106);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar8,auVar153);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar8,local_4a0);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),local_6c0,auVar8);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar109,local_7a0);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar109,local_440);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),local_780,auVar109);
          pfVar3 = (float *)(lVar87 + 0x2203ee4 + lVar89 * 4);
          fVar141 = *pfVar3;
          fVar140 = pfVar3[1];
          fVar111 = pfVar3[2];
          fVar113 = pfVar3[3];
          fVar115 = pfVar3[4];
          fVar116 = pfVar3[5];
          fVar117 = pfVar3[6];
          auVar46._4_4_ = fStack_5fc * fVar140;
          auVar46._0_4_ = local_600 * fVar141;
          auVar46._8_4_ = fStack_5f8 * fVar111;
          auVar46._12_4_ = fStack_5f4 * fVar113;
          auVar46._16_4_ = fStack_5f0 * fVar115;
          auVar46._20_4_ = fStack_5ec * fVar116;
          auVar46._24_4_ = fStack_5e8 * fVar117;
          auVar46._28_4_ = local_620._28_4_;
          auVar47._4_4_ = fVar205 * fVar140;
          auVar47._0_4_ = fVar198 * fVar141;
          auVar47._8_4_ = fVar206 * fVar111;
          auVar47._12_4_ = fVar208 * fVar113;
          auVar47._16_4_ = fVar210 * fVar115;
          auVar47._20_4_ = fVar212 * fVar116;
          auVar47._24_4_ = fVar214 * fVar117;
          auVar47._28_4_ = auVar156._28_4_;
          auVar48._4_4_ = fVar140 * (float)local_6e0._4_4_;
          auVar48._0_4_ = fVar141 * (float)local_6e0._0_4_;
          auVar48._8_4_ = fVar111 * fStack_6d8;
          auVar48._12_4_ = fVar113 * fStack_6d4;
          auVar48._16_4_ = fVar115 * fStack_6d0;
          auVar48._20_4_ = fVar116 * fStack_6cc;
          auVar48._24_4_ = fVar117 * fStack_6c8;
          auVar48._28_4_ = pfVar3[7];
          auVar109 = *(undefined1 (*) [32])(lVar87 + 0x2203a60 + lVar89 * 4);
          auVar142 = vfmadd231ps_fma(auVar46,auVar109,local_560);
          auVar94 = vfmadd231ps_fma(auVar47,auVar109,local_720);
          auVar122 = vfmadd231ps_fma(auVar48,auVar109,local_620);
          auVar109 = *(undefined1 (*) [32])(lVar87 + 0x22035dc + lVar89 * 4);
          auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar109,auVar153);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar109,local_4a0);
          auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar109,local_6c0);
          auVar109 = *(undefined1 (*) [32])(lVar87 + 0x2203158 + lVar89 * 4);
          auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar109,local_7a0);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar109,local_440);
          auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),local_780,auVar109);
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar203._16_4_ = 0x7fffffff;
          auVar203._20_4_ = 0x7fffffff;
          auVar203._24_4_ = 0x7fffffff;
          auVar203._28_4_ = 0x7fffffff;
          auVar109 = vandps_avx(ZEXT1632(auVar96),auVar203);
          auVar8 = vandps_avx(ZEXT1632(auVar95),auVar203);
          auVar8 = vmaxps_avx(auVar109,auVar8);
          auVar109 = vandps_avx(ZEXT1632(auVar121),auVar203);
          auVar109 = vmaxps_avx(auVar8,auVar109);
          auVar109 = vcmpps_avx(auVar109,_local_320,1);
          auVar106 = vblendvps_avx(ZEXT1632(auVar96),local_460,auVar109);
          auVar154 = vblendvps_avx(ZEXT1632(auVar95),local_2c0,auVar109);
          auVar109 = vandps_avx(ZEXT1632(auVar142),auVar203);
          auVar8 = vandps_avx(ZEXT1632(auVar94),auVar203);
          auVar8 = vmaxps_avx(auVar109,auVar8);
          auVar109 = vandps_avx(auVar203,ZEXT1632(auVar122));
          auVar109 = vmaxps_avx(auVar8,auVar109);
          auVar8 = vcmpps_avx(auVar109,_local_320,1);
          auVar109 = vblendvps_avx(ZEXT1632(auVar142),local_460,auVar8);
          auVar8 = vblendvps_avx(ZEXT1632(auVar94),local_2c0,auVar8);
          auVar165 = vfmadd213ps_fma(auVar100,local_780,ZEXT1632(auVar165));
          auVar96 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar154,auVar154);
          auVar100 = vrsqrtps_avx(ZEXT1632(auVar96));
          fVar141 = auVar100._0_4_;
          fVar140 = auVar100._4_4_;
          fVar111 = auVar100._8_4_;
          fVar113 = auVar100._12_4_;
          fVar115 = auVar100._16_4_;
          fVar116 = auVar100._20_4_;
          fVar117 = auVar100._24_4_;
          auVar49._4_4_ = fVar140 * fVar140 * fVar140 * auVar96._4_4_ * -0.5;
          auVar49._0_4_ = fVar141 * fVar141 * fVar141 * auVar96._0_4_ * -0.5;
          auVar49._8_4_ = fVar111 * fVar111 * fVar111 * auVar96._8_4_ * -0.5;
          auVar49._12_4_ = fVar113 * fVar113 * fVar113 * auVar96._12_4_ * -0.5;
          auVar49._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
          auVar49._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
          auVar49._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
          auVar49._28_4_ = 0;
          auVar234._8_4_ = 0x3fc00000;
          auVar234._0_8_ = 0x3fc000003fc00000;
          auVar234._12_4_ = 0x3fc00000;
          auVar234._16_4_ = 0x3fc00000;
          auVar234._20_4_ = 0x3fc00000;
          auVar234._24_4_ = 0x3fc00000;
          auVar234._28_4_ = 0x3fc00000;
          auVar96 = vfmadd231ps_fma(auVar49,auVar234,auVar100);
          fVar141 = auVar96._0_4_;
          fVar140 = auVar96._4_4_;
          auVar50._4_4_ = auVar154._4_4_ * fVar140;
          auVar50._0_4_ = auVar154._0_4_ * fVar141;
          fVar111 = auVar96._8_4_;
          auVar50._8_4_ = auVar154._8_4_ * fVar111;
          fVar113 = auVar96._12_4_;
          auVar50._12_4_ = auVar154._12_4_ * fVar113;
          auVar50._16_4_ = auVar154._16_4_ * 0.0;
          auVar50._20_4_ = auVar154._20_4_ * 0.0;
          auVar50._24_4_ = auVar154._24_4_ * 0.0;
          auVar50._28_4_ = auVar100._28_4_;
          auVar51._4_4_ = fVar140 * -auVar106._4_4_;
          auVar51._0_4_ = fVar141 * -auVar106._0_4_;
          auVar51._8_4_ = fVar111 * -auVar106._8_4_;
          auVar51._12_4_ = fVar113 * -auVar106._12_4_;
          auVar51._16_4_ = -auVar106._16_4_ * 0.0;
          auVar51._20_4_ = -auVar106._20_4_ * 0.0;
          auVar51._24_4_ = -auVar106._24_4_ * 0.0;
          auVar51._28_4_ = auVar154._28_4_;
          auVar96 = vfmadd213ps_fma(auVar109,auVar109,ZEXT832(0) << 0x20);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar8,auVar8);
          auVar100 = vrsqrtps_avx(ZEXT1632(auVar96));
          auVar52._28_4_ = auVar156._28_4_;
          auVar52._0_28_ =
               ZEXT1628(CONCAT412(fVar113 * 0.0,
                                  CONCAT48(fVar111 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
          fVar141 = auVar100._0_4_;
          fVar140 = auVar100._4_4_;
          fVar111 = auVar100._8_4_;
          fVar113 = auVar100._12_4_;
          fVar115 = auVar100._16_4_;
          fVar116 = auVar100._20_4_;
          fVar117 = auVar100._24_4_;
          auVar53._4_4_ = fVar140 * fVar140 * fVar140 * auVar96._4_4_ * -0.5;
          auVar53._0_4_ = fVar141 * fVar141 * fVar141 * auVar96._0_4_ * -0.5;
          auVar53._8_4_ = fVar111 * fVar111 * fVar111 * auVar96._8_4_ * -0.5;
          auVar53._12_4_ = fVar113 * fVar113 * fVar113 * auVar96._12_4_ * -0.5;
          auVar53._16_4_ = fVar115 * fVar115 * fVar115 * -0.0;
          auVar53._20_4_ = fVar116 * fVar116 * fVar116 * -0.0;
          auVar53._24_4_ = fVar117 * fVar117 * fVar117 * -0.0;
          auVar53._28_4_ = 0;
          auVar96 = vfmadd231ps_fma(auVar53,auVar234,auVar100);
          fVar141 = auVar96._0_4_;
          fVar140 = auVar96._4_4_;
          auVar54._4_4_ = auVar8._4_4_ * fVar140;
          auVar54._0_4_ = auVar8._0_4_ * fVar141;
          fVar111 = auVar96._8_4_;
          auVar54._8_4_ = auVar8._8_4_ * fVar111;
          fVar113 = auVar96._12_4_;
          auVar54._12_4_ = auVar8._12_4_ * fVar113;
          auVar54._16_4_ = auVar8._16_4_ * 0.0;
          auVar54._20_4_ = auVar8._20_4_ * 0.0;
          auVar54._24_4_ = auVar8._24_4_ * 0.0;
          auVar54._28_4_ = 0;
          auVar55._4_4_ = fVar140 * -auVar109._4_4_;
          auVar55._0_4_ = fVar141 * -auVar109._0_4_;
          auVar55._8_4_ = fVar111 * -auVar109._8_4_;
          auVar55._12_4_ = fVar113 * -auVar109._12_4_;
          auVar55._16_4_ = -auVar109._16_4_ * 0.0;
          auVar55._20_4_ = -auVar109._20_4_ * 0.0;
          auVar55._24_4_ = -auVar109._24_4_ * 0.0;
          auVar55._28_4_ = auVar100._28_4_;
          auVar56._28_4_ = 0xbf000000;
          auVar56._0_28_ =
               ZEXT1628(CONCAT412(fVar113 * 0.0,
                                  CONCAT48(fVar111 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
          auVar96 = vfmadd213ps_fma(auVar50,auVar134,local_5a0);
          auVar95 = vfmadd213ps_fma(auVar51,auVar134,local_680);
          auVar121 = vfmadd213ps_fma(auVar52,auVar134,ZEXT1632(auVar165));
          auVar161 = vfnmadd213ps_fma(auVar50,auVar134,local_5a0);
          auVar142 = vfmadd213ps_fma(auVar54,auVar228,local_580);
          auVar93 = vfnmadd213ps_fma(auVar51,auVar134,local_680);
          auVar94 = vfmadd213ps_fma(auVar55,auVar228,auVar186);
          auVar165 = vfnmadd231ps_fma(ZEXT1632(auVar165),auVar134,auVar52);
          auVar122 = vfmadd213ps_fma(auVar56,auVar228,_local_5c0);
          auVar120 = vfnmadd213ps_fma(auVar54,auVar228,local_580);
          auVar175 = vfnmadd213ps_fma(auVar55,auVar228,auVar186);
          auVar180 = vfnmadd231ps_fma(_local_5c0,auVar228,auVar56);
          auVar100 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93));
          auVar109 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar165));
          auVar57._4_4_ = auVar100._4_4_ * auVar165._4_4_;
          auVar57._0_4_ = auVar100._0_4_ * auVar165._0_4_;
          auVar57._8_4_ = auVar100._8_4_ * auVar165._8_4_;
          auVar57._12_4_ = auVar100._12_4_ * auVar165._12_4_;
          auVar57._16_4_ = auVar100._16_4_ * 0.0;
          auVar57._20_4_ = auVar100._20_4_ * 0.0;
          auVar57._24_4_ = auVar100._24_4_ * 0.0;
          auVar57._28_4_ = 0;
          auVar157 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar93),auVar109);
          auVar58._4_4_ = auVar161._4_4_ * auVar109._4_4_;
          auVar58._0_4_ = auVar161._0_4_ * auVar109._0_4_;
          auVar58._8_4_ = auVar161._8_4_ * auVar109._8_4_;
          auVar58._12_4_ = auVar161._12_4_ * auVar109._12_4_;
          auVar58._16_4_ = auVar109._16_4_ * 0.0;
          auVar58._20_4_ = auVar109._20_4_ * 0.0;
          auVar58._24_4_ = auVar109._24_4_ * 0.0;
          auVar58._28_4_ = auVar109._28_4_;
          auVar104 = ZEXT1632(auVar161);
          auVar109 = vsubps_avx(ZEXT1632(auVar142),auVar104);
          auVar105 = ZEXT1632(auVar165);
          auVar165 = vfmsub231ps_fma(auVar58,auVar105,auVar109);
          auVar59._4_4_ = auVar93._4_4_ * auVar109._4_4_;
          auVar59._0_4_ = auVar93._0_4_ * auVar109._0_4_;
          auVar59._8_4_ = auVar93._8_4_ * auVar109._8_4_;
          auVar59._12_4_ = auVar93._12_4_ * auVar109._12_4_;
          auVar59._16_4_ = auVar109._16_4_ * 0.0;
          auVar59._20_4_ = auVar109._20_4_ * 0.0;
          auVar59._24_4_ = auVar109._24_4_ * 0.0;
          auVar59._28_4_ = auVar109._28_4_;
          auVar161 = vfmsub231ps_fma(auVar59,auVar104,auVar100);
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar161),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar157));
          auVar19 = vcmpps_avx(ZEXT1632(auVar165),ZEXT832(0) << 0x20,2);
          auVar100 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar96),auVar19);
          auVar109 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar95),auVar19);
          local_680 = vblendvps_avx(ZEXT1632(auVar180),ZEXT1632(auVar121),auVar19);
          auVar8 = vblendvps_avx(auVar104,ZEXT1632(auVar142),auVar19);
          auVar106 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar94),auVar19);
          auVar154 = vblendvps_avx(auVar105,ZEXT1632(auVar122),auVar19);
          auVar104 = vblendvps_avx(ZEXT1632(auVar142),auVar104,auVar19);
          auVar130 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93),auVar19);
          auVar165 = vpackssdw_avx(local_480._0_16_,local_480._16_16_);
          auVar105 = vblendvps_avx(ZEXT1632(auVar122),auVar105,auVar19);
          auVar104 = vsubps_avx(auVar104,auVar100);
          auVar130 = vsubps_avx(auVar130,auVar109);
          auVar153 = vsubps_avx(auVar105,local_680);
          auVar226 = ZEXT3264(auVar153);
          auVar186 = vsubps_avx(auVar100,auVar8);
          auVar98 = vsubps_avx(auVar109,auVar106);
          auVar125 = vsubps_avx(local_680,auVar154);
          auVar229 = ZEXT3264(auVar125);
          auVar177._0_4_ = auVar153._0_4_ * auVar100._0_4_;
          auVar177._4_4_ = auVar153._4_4_ * auVar100._4_4_;
          auVar177._8_4_ = auVar153._8_4_ * auVar100._8_4_;
          auVar177._12_4_ = auVar153._12_4_ * auVar100._12_4_;
          auVar177._16_4_ = auVar153._16_4_ * auVar100._16_4_;
          auVar177._20_4_ = auVar153._20_4_ * auVar100._20_4_;
          auVar177._24_4_ = auVar153._24_4_ * auVar100._24_4_;
          auVar177._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar177,local_680,auVar104);
          auVar60._4_4_ = auVar104._4_4_ * auVar109._4_4_;
          auVar60._0_4_ = auVar104._0_4_ * auVar109._0_4_;
          auVar60._8_4_ = auVar104._8_4_ * auVar109._8_4_;
          auVar60._12_4_ = auVar104._12_4_ * auVar109._12_4_;
          auVar60._16_4_ = auVar104._16_4_ * auVar109._16_4_;
          auVar60._20_4_ = auVar104._20_4_ * auVar109._20_4_;
          auVar60._24_4_ = auVar104._24_4_ * auVar109._24_4_;
          auVar60._28_4_ = auVar105._28_4_;
          auVar95 = vfmsub231ps_fma(auVar60,auVar100,auVar130);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
          auVar178._0_4_ = auVar130._0_4_ * local_680._0_4_;
          auVar178._4_4_ = auVar130._4_4_ * local_680._4_4_;
          auVar178._8_4_ = auVar130._8_4_ * local_680._8_4_;
          auVar178._12_4_ = auVar130._12_4_ * local_680._12_4_;
          auVar178._16_4_ = auVar130._16_4_ * local_680._16_4_;
          auVar178._20_4_ = auVar130._20_4_ * local_680._20_4_;
          auVar178._24_4_ = auVar130._24_4_ * local_680._24_4_;
          auVar178._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar178,auVar109,auVar153);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar95));
          auVar179._0_4_ = auVar125._0_4_ * auVar8._0_4_;
          auVar179._4_4_ = auVar125._4_4_ * auVar8._4_4_;
          auVar179._8_4_ = auVar125._8_4_ * auVar8._8_4_;
          auVar179._12_4_ = auVar125._12_4_ * auVar8._12_4_;
          auVar179._16_4_ = auVar125._16_4_ * auVar8._16_4_;
          auVar179._20_4_ = auVar125._20_4_ * auVar8._20_4_;
          auVar179._24_4_ = auVar125._24_4_ * auVar8._24_4_;
          auVar179._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar179,auVar186,auVar154);
          auVar61._4_4_ = auVar98._4_4_ * auVar154._4_4_;
          auVar61._0_4_ = auVar98._0_4_ * auVar154._0_4_;
          auVar61._8_4_ = auVar98._8_4_ * auVar154._8_4_;
          auVar61._12_4_ = auVar98._12_4_ * auVar154._12_4_;
          auVar61._16_4_ = auVar98._16_4_ * auVar154._16_4_;
          auVar61._20_4_ = auVar98._20_4_ * auVar154._20_4_;
          auVar61._24_4_ = auVar98._24_4_ * auVar154._24_4_;
          auVar61._28_4_ = auVar100._28_4_;
          auVar121 = vfmsub231ps_fma(auVar61,auVar106,auVar125);
          auVar62._4_4_ = auVar186._4_4_ * auVar106._4_4_;
          auVar62._0_4_ = auVar186._0_4_ * auVar106._0_4_;
          auVar62._8_4_ = auVar186._8_4_ * auVar106._8_4_;
          auVar62._12_4_ = auVar186._12_4_ * auVar106._12_4_;
          auVar62._16_4_ = auVar186._16_4_ * auVar106._16_4_;
          auVar62._20_4_ = auVar186._20_4_ * auVar106._20_4_;
          auVar62._24_4_ = auVar186._24_4_ * auVar106._24_4_;
          auVar62._28_4_ = auVar106._28_4_;
          auVar142 = vfmsub231ps_fma(auVar62,auVar98,auVar8);
          auVar106 = ZEXT832(0) << 0x20;
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar106,ZEXT1632(auVar96));
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar106,ZEXT1632(auVar121));
          auVar8 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar121));
          auVar8 = vcmpps_avx(auVar8,auVar106,2);
          auVar142 = auVar8._16_16_;
          auVar96 = vpackssdw_avx(auVar8._0_16_,auVar142);
          auVar165 = vpand_avx(auVar96,auVar165);
          auVar8 = vpmovsxwd_avx2(auVar165);
          if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar8 >> 0x7f,0) == '\0') &&
                (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar8 >> 0xbf,0) == '\0') &&
              (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar8[0x1f]) {
LAB_01125ee3:
            auVar159._8_8_ = local_540[1]._8_8_;
            auVar159._0_8_ = local_540[1]._0_8_;
            auVar159._16_8_ = local_540[1]._16_8_;
            auVar159._24_8_ = local_540[1]._24_8_;
            auVar188 = ZEXT1664(auVar142);
          }
          else {
            auVar63._4_4_ = auVar130._4_4_ * auVar125._4_4_;
            auVar63._0_4_ = auVar130._0_4_ * auVar125._0_4_;
            auVar63._8_4_ = auVar130._8_4_ * auVar125._8_4_;
            auVar63._12_4_ = auVar130._12_4_ * auVar125._12_4_;
            auVar63._16_4_ = auVar130._16_4_ * auVar125._16_4_;
            auVar63._20_4_ = auVar130._20_4_ * auVar125._20_4_;
            auVar63._24_4_ = auVar130._24_4_ * auVar125._24_4_;
            auVar63._28_4_ = auVar8._28_4_;
            auVar122 = vfmsub231ps_fma(auVar63,auVar98,auVar153);
            auVar187._0_4_ = auVar153._0_4_ * auVar186._0_4_;
            auVar187._4_4_ = auVar153._4_4_ * auVar186._4_4_;
            auVar187._8_4_ = auVar153._8_4_ * auVar186._8_4_;
            auVar187._12_4_ = auVar153._12_4_ * auVar186._12_4_;
            auVar187._16_4_ = auVar153._16_4_ * auVar186._16_4_;
            auVar187._20_4_ = auVar153._20_4_ * auVar186._20_4_;
            auVar187._24_4_ = auVar153._24_4_ * auVar186._24_4_;
            auVar187._28_4_ = 0;
            auVar142 = vfmsub231ps_fma(auVar187,auVar104,auVar125);
            auVar64._4_4_ = auVar104._4_4_ * auVar98._4_4_;
            auVar64._0_4_ = auVar104._0_4_ * auVar98._0_4_;
            auVar64._8_4_ = auVar104._8_4_ * auVar98._8_4_;
            auVar64._12_4_ = auVar104._12_4_ * auVar98._12_4_;
            auVar64._16_4_ = auVar104._16_4_ * auVar98._16_4_;
            auVar64._20_4_ = auVar104._20_4_ * auVar98._20_4_;
            auVar64._24_4_ = auVar104._24_4_ * auVar98._24_4_;
            auVar64._28_4_ = auVar98._28_4_;
            auVar157 = vfmsub231ps_fma(auVar64,auVar186,auVar130);
            auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar142),ZEXT1632(auVar157));
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar122),auVar106);
            auVar8 = vrcpps_avx(ZEXT1632(auVar94));
            auVar225._8_4_ = 0x3f800000;
            auVar225._0_8_ = 0x3f8000003f800000;
            auVar225._12_4_ = 0x3f800000;
            auVar225._16_4_ = 0x3f800000;
            auVar225._20_4_ = 0x3f800000;
            auVar225._24_4_ = 0x3f800000;
            auVar225._28_4_ = 0x3f800000;
            auVar226 = ZEXT3264(auVar225);
            auVar96 = vfnmadd213ps_fma(auVar8,ZEXT1632(auVar94),auVar225);
            auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar8,auVar8);
            auVar65._4_4_ = auVar157._4_4_ * local_680._4_4_;
            auVar65._0_4_ = auVar157._0_4_ * local_680._0_4_;
            auVar65._8_4_ = auVar157._8_4_ * local_680._8_4_;
            auVar65._12_4_ = auVar157._12_4_ * local_680._12_4_;
            auVar65._16_4_ = local_680._16_4_ * 0.0;
            auVar65._20_4_ = local_680._20_4_ * 0.0;
            auVar65._24_4_ = local_680._24_4_ * 0.0;
            auVar65._28_4_ = auVar109._28_4_;
            auVar142 = vfmadd231ps_fma(auVar65,ZEXT1632(auVar142),auVar109);
            auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),ZEXT1632(auVar122),auVar100);
            fVar141 = auVar96._0_4_;
            fVar140 = auVar96._4_4_;
            fVar111 = auVar96._8_4_;
            fVar113 = auVar96._12_4_;
            auVar106 = ZEXT1632(CONCAT412(fVar113 * auVar142._12_4_,
                                          CONCAT48(fVar111 * auVar142._8_4_,
                                                   CONCAT44(fVar140 * auVar142._4_4_,
                                                            fVar141 * auVar142._0_4_))));
            uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar158._4_4_ = uVar90;
            auVar158._0_4_ = uVar90;
            auVar158._8_4_ = uVar90;
            auVar158._12_4_ = uVar90;
            auVar158._16_4_ = uVar90;
            auVar158._20_4_ = uVar90;
            auVar158._24_4_ = uVar90;
            auVar158._28_4_ = uVar90;
            auVar80._4_4_ = uStack_4fc;
            auVar80._0_4_ = local_500;
            auVar80._8_4_ = uStack_4f8;
            auVar80._12_4_ = uStack_4f4;
            auVar80._16_4_ = uStack_4f0;
            auVar80._20_4_ = uStack_4ec;
            auVar80._24_4_ = uStack_4e8;
            auVar80._28_4_ = uStack_4e4;
            auVar100 = vcmpps_avx(auVar80,auVar106,2);
            auVar8 = vcmpps_avx(auVar106,auVar158,2);
            auVar100 = vandps_avx(auVar8,auVar100);
            auVar96 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            auVar165 = vpand_avx(auVar165,auVar96);
            auVar100 = vpmovsxwd_avx2(auVar165);
            auVar142 = ZEXT816(0) << 0x20;
            if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar100 >> 0x7f,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar100 >> 0xbf,0) == '\0') &&
                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar100[0x1f]) goto LAB_01125ee3;
            auVar100 = vcmpps_avx(ZEXT1632(auVar94),ZEXT832(0) << 0x20,4);
            auVar96 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            auVar165 = vpand_avx(auVar165,auVar96);
            auVar100 = vpmovsxwd_avx2(auVar165);
            auVar188 = ZEXT3264(auVar100);
            auVar159._8_8_ = local_540[1]._8_8_;
            auVar159._0_8_ = local_540[1]._0_8_;
            auVar159._16_8_ = local_540[1]._16_8_;
            auVar159._24_8_ = local_540[1]._24_8_;
            if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar100 >> 0x7f,0) != '\0') ||
                  (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0xbf,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar100[0x1f] < '\0') {
              auVar154 = ZEXT1632(CONCAT412(fVar113 * auVar95._12_4_,
                                            CONCAT48(fVar111 * auVar95._8_4_,
                                                     CONCAT44(fVar140 * auVar95._4_4_,
                                                              fVar141 * auVar95._0_4_))));
              auVar66._28_4_ = SUB84(local_540[1]._24_8_,4);
              auVar66._0_28_ =
                   ZEXT1628(CONCAT412(fVar113 * auVar121._12_4_,
                                      CONCAT48(fVar111 * auVar121._8_4_,
                                               CONCAT44(fVar140 * auVar121._4_4_,
                                                        fVar141 * auVar121._0_4_))));
              auVar196._8_4_ = 0x3f800000;
              auVar196._0_8_ = 0x3f8000003f800000;
              auVar196._12_4_ = 0x3f800000;
              auVar196._16_4_ = 0x3f800000;
              auVar196._20_4_ = 0x3f800000;
              auVar196._24_4_ = 0x3f800000;
              auVar196._28_4_ = 0x3f800000;
              auVar8 = vsubps_avx(auVar196,auVar154);
              local_660 = vblendvps_avx(auVar8,auVar154,auVar19);
              auVar8 = vsubps_avx(auVar196,auVar66);
              local_380 = vblendvps_avx(auVar8,auVar66,auVar19);
              local_360 = auVar106;
              auVar159 = auVar100;
            }
          }
          auVar235 = ZEXT3264(local_7a0);
          auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                        CONCAT424(fStack_628,
                                                  CONCAT420(fStack_62c,
                                                            CONCAT416(fStack_630,
                                                                      CONCAT412(fStack_634,
                                                                                CONCAT48(fStack_638,
                                                                                         CONCAT44(
                                                  fStack_63c,local_640))))))));
          local_4c0 = auVar134;
          if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar159 >> 0x7f,0) == '\0') &&
                (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0xbf,0) == '\0') &&
              (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar159[0x1f]) {
            auVar139 = ZEXT3264(local_660);
            auVar156 = ZEXT3264(local_5e0);
            auVar197 = ZEXT3264(local_720);
          }
          else {
            auVar100 = vsubps_avx(auVar228,auVar134);
            auVar165 = vfmadd213ps_fma(auVar100,local_660,auVar134);
            fVar141 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar67._4_4_ = (auVar165._4_4_ + auVar165._4_4_) * fVar141;
            auVar67._0_4_ = (auVar165._0_4_ + auVar165._0_4_) * fVar141;
            auVar67._8_4_ = (auVar165._8_4_ + auVar165._8_4_) * fVar141;
            auVar67._12_4_ = (auVar165._12_4_ + auVar165._12_4_) * fVar141;
            auVar67._16_4_ = fVar141 * 0.0;
            auVar67._20_4_ = fVar141 * 0.0;
            auVar67._24_4_ = fVar141 * 0.0;
            auVar67._28_4_ = fVar141;
            auVar100 = vcmpps_avx(local_360,auVar67,6);
            auVar8 = auVar159 & auVar100;
            auVar156 = ZEXT3264(local_5e0);
            auVar197 = ZEXT3264(local_720);
            if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar8 >> 0x7f,0) == '\0') &&
                  (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar8 >> 0xbf,0) == '\0') &&
                (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar8[0x1f]) {
              auVar139 = ZEXT3264(local_660);
            }
            else {
              auVar135._8_4_ = 0xbf800000;
              auVar135._0_8_ = 0xbf800000bf800000;
              auVar135._12_4_ = 0xbf800000;
              auVar135._16_4_ = 0xbf800000;
              auVar135._20_4_ = 0xbf800000;
              auVar135._24_4_ = 0xbf800000;
              auVar135._28_4_ = 0xbf800000;
              auVar155._8_4_ = 0x40000000;
              auVar155._0_8_ = 0x4000000040000000;
              auVar155._12_4_ = 0x40000000;
              auVar155._16_4_ = 0x40000000;
              auVar155._20_4_ = 0x40000000;
              auVar155._24_4_ = 0x40000000;
              auVar155._28_4_ = 0x40000000;
              auVar165 = vfmadd213ps_fma(local_380,auVar155,auVar135);
              auVar188 = ZEXT1664(auVar165);
              local_260 = local_660;
              local_380 = ZEXT1632(auVar165);
              auVar8 = local_380;
              local_240 = ZEXT1632(auVar165);
              local_220 = local_360;
              local_1fc = iVar11;
              local_1f0 = uVar78;
              uStack_1e8 = uVar79;
              local_1e0 = local_7c0;
              uStack_1d8 = uStack_7b8;
              local_1d0 = local_7d0;
              uStack_1c8 = uStack_7c8;
              local_1c0 = local_7e0;
              uStack_1b8 = uStack_7d8;
              pGVar12 = (context->scene->geometries).items[uVar10].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_540[0] = vandps_avx(auVar100,auVar159);
                fVar141 = (float)local_200;
                local_180[0] = (fVar141 + local_660._0_4_ + 0.0) * local_100;
                local_180[1] = (fVar141 + local_660._4_4_ + 1.0) * fStack_fc;
                local_180[2] = (fVar141 + local_660._8_4_ + 2.0) * fStack_f8;
                local_180[3] = (fVar141 + local_660._12_4_ + 3.0) * fStack_f4;
                fStack_170 = (fVar141 + local_660._16_4_ + 4.0) * fStack_f0;
                fStack_16c = (fVar141 + local_660._20_4_ + 5.0) * fStack_ec;
                fStack_168 = (fVar141 + local_660._24_4_ + 6.0) * fStack_e8;
                fStack_164 = fVar141 + local_660._28_4_ + 7.0;
                local_380._0_8_ = auVar165._0_8_;
                local_380._8_8_ = auVar165._8_8_;
                local_160 = local_380._0_8_;
                uStack_158 = local_380._8_8_;
                uStack_150 = 0;
                uStack_148 = 0;
                local_140 = local_360;
                auVar136._8_4_ = 0x7f800000;
                auVar136._0_8_ = 0x7f8000007f800000;
                auVar136._12_4_ = 0x7f800000;
                auVar136._16_4_ = 0x7f800000;
                auVar136._20_4_ = 0x7f800000;
                auVar136._24_4_ = 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar100 = vblendvps_avx(auVar136,local_360,local_540[0]);
                auVar106 = vshufps_avx(auVar100,auVar100,0xb1);
                auVar106 = vminps_avx(auVar100,auVar106);
                auVar154 = vshufpd_avx(auVar106,auVar106,5);
                auVar106 = vminps_avx(auVar106,auVar154);
                auVar154 = vpermpd_avx2(auVar106,0x4e);
                auVar106 = vminps_avx(auVar106,auVar154);
                auVar106 = vcmpps_avx(auVar100,auVar106,0);
                auVar154 = local_540[0] & auVar106;
                auVar100 = local_540[0];
                if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar154 >> 0x7f,0) != '\0') ||
                      (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar154 >> 0xbf,0) != '\0') ||
                    (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar154[0x1f] < '\0') {
                  auVar100 = vandps_avx(auVar106,local_540[0]);
                }
                local_680._0_8_ = lVar89;
                uVar84 = vmovmskps_avx(auVar100);
                uVar5 = 0;
                for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                  uVar5 = uVar5 + 1;
                }
                uVar85 = (ulong)uVar5;
                local_380 = auVar8;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar141 = local_180[uVar85];
                  uVar90 = *(undefined4 *)((long)&local_160 + uVar85 * 4);
                  fVar140 = 1.0 - fVar141;
                  auVar165 = ZEXT416((uint)(fVar141 * fVar140 * 4.0));
                  auVar168 = vfnmsub213ss_fma(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),auVar165
                                             );
                  auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),auVar165)
                  ;
                  auVar188 = ZEXT464(0x3f000000);
                  fVar140 = fVar140 * -fVar140 * 0.5;
                  fVar111 = auVar168._0_4_ * 0.5;
                  fVar113 = auVar165._0_4_ * 0.5;
                  fVar115 = fVar141 * fVar141 * 0.5;
                  auVar166._0_4_ = fVar115 * fVar110;
                  auVar166._4_4_ = fVar115 * fVar112;
                  auVar166._8_4_ = fVar115 * fVar114;
                  auVar166._12_4_ = fVar115 * fVar68;
                  auVar145._4_4_ = fVar113;
                  auVar145._0_4_ = fVar113;
                  auVar145._8_4_ = fVar113;
                  auVar145._12_4_ = fVar113;
                  auVar165 = vfmadd132ps_fma(auVar145,auVar166,auVar18);
                  auVar167._4_4_ = fVar111;
                  auVar167._0_4_ = fVar111;
                  auVar167._8_4_ = fVar111;
                  auVar167._12_4_ = fVar111;
                  auVar165 = vfmadd132ps_fma(auVar167,auVar165,auVar17);
                  auVar146._4_4_ = fVar140;
                  auVar146._0_4_ = fVar140;
                  auVar146._8_4_ = fVar140;
                  auVar146._12_4_ = fVar140;
                  auVar165 = vfmadd132ps_fma(auVar146,auVar165,auVar15);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar85 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                  uVar220 = vextractps_avx(auVar165,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar220;
                  uVar220 = vextractps_avx(auVar165,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar220;
                  *(float *)(ray + k * 4 + 0xf0) = fVar141;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar90;
                  *(uint *)(ray + k * 4 + 0x110) = uVar83;
                  *(uint *)(ray + k * 4 + 0x120) = uVar10;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_700 = ZEXT1632(CONCAT88(auVar168._8_8_,local_700._0_8_));
                  auVar165 = *local_688;
                  auStack_870 = auVar109._16_16_;
                  local_880 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  _local_2e0 = auVar99;
                  while( true ) {
                    auVar100 = _local_880;
                    fVar141 = local_180[uVar85];
                    local_3e0._4_4_ = fVar141;
                    local_3e0._0_4_ = fVar141;
                    local_3e0._8_4_ = fVar141;
                    local_3e0._12_4_ = fVar141;
                    local_3d0 = *(undefined4 *)((long)&local_160 + uVar85 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar85 * 4);
                    fVar111 = 1.0 - fVar141;
                    auVar168 = ZEXT416((uint)(fVar141 * fVar111 * 4.0));
                    auVar96 = vfnmsub213ss_fma(local_3e0,local_3e0,auVar168);
                    auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar111),ZEXT416((uint)fVar111),
                                               auVar168);
                    auVar188 = ZEXT464(0x3f000000);
                    fVar140 = auVar168._0_4_ * 0.5;
                    fVar141 = fVar141 * fVar141 * 0.5;
                    auVar169._0_4_ = fVar141 * fVar110;
                    auVar169._4_4_ = fVar141 * fVar112;
                    auVar169._8_4_ = fVar141 * fVar114;
                    auVar169._12_4_ = fVar141 * fVar68;
                    auVar147._4_4_ = fVar140;
                    auVar147._0_4_ = fVar140;
                    auVar147._8_4_ = fVar140;
                    auVar147._12_4_ = fVar140;
                    auVar168 = vfmadd132ps_fma(auVar147,auVar169,auVar18);
                    fVar141 = auVar96._0_4_ * 0.5;
                    auVar170._4_4_ = fVar141;
                    auVar170._0_4_ = fVar141;
                    auVar170._8_4_ = fVar141;
                    auVar170._12_4_ = fVar141;
                    auVar168 = vfmadd132ps_fma(auVar170,auVar168,auVar17);
                    local_750.context = context->user;
                    fVar141 = fVar111 * -fVar111 * 0.5;
                    auVar148._4_4_ = fVar141;
                    auVar148._0_4_ = fVar141;
                    auVar148._8_4_ = fVar141;
                    auVar148._12_4_ = fVar141;
                    auVar96 = vfmadd132ps_fma(auVar148,auVar168,auVar16);
                    local_410 = auVar96._0_4_;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    auVar168 = vshufps_avx(auVar96,auVar96,0x55);
                    local_400 = auVar168;
                    local_3f0 = vshufps_avx(auVar96,auVar96,0xaa);
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    local_3c0 = CONCAT44(uStack_29c,local_2a0);
                    uStack_3b8 = CONCAT44(uStack_294,uStack_298);
                    local_3b0._4_4_ = uStack_28c;
                    local_3b0._0_4_ = local_290;
                    local_3b0._8_4_ = uStack_288;
                    local_3b0._12_4_ = uStack_284;
                    vpcmpeqd_avx2(ZEXT1632(local_3b0),ZEXT1632(local_3b0));
                    uStack_39c = (local_750.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_750.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_750.valid = (int *)local_7b0;
                    local_750.geometryUserPtr = pGVar12->userPtr;
                    local_750.hit = (RTCHitN *)&local_410;
                    local_750.N = 4;
                    local_7b0 = auVar165;
                    local_750.ray = (RTCRayN *)ray;
                    if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar188 = ZEXT1664(auVar188._0_16_);
                      auVar226 = ZEXT1664(auVar226._0_16_);
                      auVar229 = ZEXT1664(auVar229._0_16_);
                      (*pGVar12->intersectionFilterN)(&local_750);
                    }
                    if (local_7b0 == (undefined1  [16])0x0) {
                      auVar168 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar96 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                      auVar168 = auVar168 ^ auVar96;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      auVar96 = vpcmpeqd_avx(auVar168,auVar168);
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar188 = ZEXT1664(auVar188._0_16_);
                        auVar226 = ZEXT1664(auVar226._0_16_);
                        auVar229 = ZEXT1664(auVar229._0_16_);
                        (*p_Var13)(&local_750);
                        auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                      }
                      auVar95 = vpcmpeqd_avx(local_7b0,_DAT_01f45a50);
                      auVar168 = auVar95 ^ auVar96;
                      if (local_7b0 != (undefined1  [16])0x0) {
                        auVar95 = auVar95 ^ auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])local_750.hit);
                        *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x10));
                        *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x20));
                        *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x30));
                        *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x40));
                        *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x50));
                        *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x60));
                        *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x70));
                        *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar96;
                        auVar96 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x80));
                        *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar96;
                      }
                    }
                    auVar109 = local_360;
                    auVar123._8_8_ = 0x100000001;
                    auVar123._0_8_ = 0x100000001;
                    if ((auVar123 & auVar168) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_880._0_4_;
                    }
                    else {
                      local_880._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_880._4_4_ = 0;
                      local_880._8_4_ = 0;
                      local_880._12_4_ = 0;
                    }
                    *(undefined4 *)(local_540[0] + uVar85 * 4) = 0;
                    auStack_870 = auVar100._16_16_;
                    auVar107._4_4_ = local_880._0_4_;
                    auVar107._0_4_ = local_880._0_4_;
                    auVar107._8_4_ = local_880._0_4_;
                    auVar107._12_4_ = local_880._0_4_;
                    auVar107._16_4_ = local_880._0_4_;
                    auVar107._20_4_ = local_880._0_4_;
                    auVar107._24_4_ = local_880._0_4_;
                    auVar107._28_4_ = local_880._0_4_;
                    auVar8 = vcmpps_avx(auVar109,auVar107,2);
                    auVar100 = vandps_avx(auVar8,local_540[0]);
                    local_540[0] = local_540[0] & auVar8;
                    if ((((((((local_540[0] >> 0x1f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0 &&
                             (local_540[0] >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_540[0] >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_540[0] >> 0x7f,0) == '\0')
                          && (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                          ) && SUB321(local_540[0] >> 0xbf,0) == '\0') &&
                        (local_540[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_540[0][0x1f]) break;
                    auVar137._8_4_ = 0x7f800000;
                    auVar137._0_8_ = 0x7f8000007f800000;
                    auVar137._12_4_ = 0x7f800000;
                    auVar137._16_4_ = 0x7f800000;
                    auVar137._20_4_ = 0x7f800000;
                    auVar137._24_4_ = 0x7f800000;
                    auVar137._28_4_ = 0x7f800000;
                    auVar109 = vblendvps_avx(auVar137,auVar109,auVar100);
                    auVar8 = vshufps_avx(auVar109,auVar109,0xb1);
                    auVar8 = vminps_avx(auVar109,auVar8);
                    auVar106 = vshufpd_avx(auVar8,auVar8,5);
                    auVar8 = vminps_avx(auVar8,auVar106);
                    auVar106 = vpermpd_avx2(auVar8,0x4e);
                    auVar8 = vminps_avx(auVar8,auVar106);
                    auVar8 = vcmpps_avx(auVar109,auVar8,0);
                    auVar106 = auVar100 & auVar8;
                    auVar109 = auVar100;
                    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar106 >> 0x7f,0) != '\0') ||
                          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar106 >> 0xbf,0) != '\0') ||
                        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar106[0x1f] < '\0') {
                      auVar109 = vandps_avx(auVar8,auVar100);
                    }
                    uVar84 = vmovmskps_avx(auVar109);
                    uVar5 = 0;
                    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                      uVar5 = uVar5 + 1;
                    }
                    uVar85 = (ulong)uVar5;
                    local_540[0] = auVar100;
                  }
                  auVar197 = ZEXT3264(local_720);
                  auVar204 = ZEXT3264(CONCAT428(fStack_624,
                                                CONCAT424(fStack_628,
                                                          CONCAT420(fStack_62c,
                                                                    CONCAT416(fStack_630,
                                                                              CONCAT412(fStack_634,
                                                                                        CONCAT48(
                                                  fStack_638,CONCAT44(fStack_63c,local_640))))))));
                  auVar235 = ZEXT3264(local_7a0);
                }
                lVar89 = local_680._0_8_;
              }
              auVar139 = ZEXT3264(local_660);
              auVar156 = ZEXT3264(local_5e0);
            }
          }
        }
        auVar160 = ZEXT3264(local_560);
      }
    }
    uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar97._4_4_ = uVar90;
    auVar97._0_4_ = uVar90;
    auVar97._8_4_ = uVar90;
    auVar97._12_4_ = uVar90;
    auVar165 = vcmpps_avx(local_280,auVar97,2);
    uVar83 = vmovmskps_avx(auVar165);
    uVar91 = (ulong)((uint)uVar91 & uVar83);
    pPVar88 = (Primitive *)local_700._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }